

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx::forward
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  int *piVar23;
  void *pvVar24;
  undefined4 *puVar25;
  void *pvVar26;
  undefined1 auVar27 [32];
  uint uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar36;
  float *pfVar37;
  uint uVar38;
  float *pfVar39;
  uint uVar40;
  ulong uVar41;
  long lVar42;
  void *pvVar43;
  long lVar44;
  long lVar45;
  float *pfVar46;
  ulong uVar47;
  ulong uVar48;
  float *pfVar49;
  long lVar50;
  uint uVar51;
  uint uVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  uint uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar80 [28];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  float fVar139;
  float fVar167;
  float fVar168;
  v4sf one;
  undefined1 auVar154 [28];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar187 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar184 [16];
  undefined1 auVar197 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar222 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar237 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  float fVar257;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar268 [32];
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar269 [64];
  Option opt_flatten;
  uint local_170;
  float *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  int local_120;
  Allocator *local_118;
  int local_110;
  int iStack_10c;
  undefined8 uStack_108;
  int iStack_100;
  size_t local_f8;
  undefined1 local_e8 [16];
  ulong local_d8;
  InnerProduct_x86_avx *local_d0;
  Mat *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar277 [12];
  undefined1 auVar118 [32];
  undefined1 auVar124 [32];
  undefined1 auVar129 [32];
  undefined1 auVar131 [32];
  undefined1 auVar161 [32];
  undefined1 auVar188 [32];
  undefined1 auVar194 [32];
  
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar35 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar35;
  }
  iVar35 = cpu_support_x86_f16c();
  if ((iVar35 != 0) && (opt->use_fp16_storage == true)) {
    iVar35 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar35;
  }
  local_110 = bottom_blob->dims;
  if ((local_110 == 2) &&
     (iVar35 = (this->super_InnerProduct).num_output,
     bottom_blob->w == (this->super_InnerProduct).weight_data_size / iVar35)) {
    Mat::create(top_blob,iVar35,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    innerproduct_gemm_sse
              (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
               (this->super_InnerProduct).activation_type,
               &(this->super_InnerProduct).activation_params,opt);
    return 0;
  }
  piVar23 = bottom_blob->refcount;
  local_138 = (float *)bottom_blob->data;
  uStack_130 = SUB84(bottom_blob->refcount,0);
  uStack_12c = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_128 = (undefined4)bottom_blob->elemsize;
  uStack_124 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_120 = bottom_blob->elempack;
  local_118 = bottom_blob->allocator;
  uVar13 = bottom_blob->w;
  uVar14 = bottom_blob->h;
  uVar15 = bottom_blob->d;
  uVar16 = bottom_blob->c;
  auVar277._8_4_ = uVar16;
  auVar277._4_4_ = uVar15;
  auVar277._0_4_ = uVar14;
  uStack_108 = auVar277._0_8_;
  local_f8 = bottom_blob->cstep;
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + 1;
    UNLOCK();
  }
  iStack_10c = uVar13;
  iStack_100 = uVar16;
  if (bottom_blob->dims != 1) {
    auVar81[0] = opt->lightmode;
    auVar81[1] = opt->use_shader_pack8;
    auVar81[2] = opt->use_subgroup_ops;
    auVar81[3] = opt->use_reserved_0;
    auVar81._4_4_ = opt->num_threads;
    auVar81._8_8_ = opt->blob_allocator;
    uVar17 = opt->workspace_allocator;
    uVar18 = opt->openmp_blocktime;
    uVar19 = opt->use_winograd_convolution;
    uVar20 = opt->use_sgemm_convolution;
    uVar21 = opt->use_int8_inference;
    uVar22 = opt->use_vulkan_compute;
    auVar81[0x1f] = uVar22;
    auVar81[0x1e] = uVar21;
    auVar81[0x1d] = uVar20;
    auVar81[0x1c] = uVar19;
    auVar81._24_4_ = uVar18;
    auVar81._16_8_ = uVar17;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_4_ = opt->vulkan_device_index;
    uStack_50._4_1_ = opt->use_reserved_1;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_2;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_fp16_uniform;
    uStack_40._4_1_ = opt->use_int8_uniform;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar81._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar81._16_16_;
    in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_138);
    if ((local_138 == (float *)0x0) || ((long)iStack_100 * local_f8 == 0)) {
      iVar35 = -100;
      goto LAB_00315029;
    }
  }
  uVar38 = 1;
  if (opt->use_packing_layout == true) {
    uVar40 = (this->super_InnerProduct).num_output;
    uVar38 = 8;
    if ((uVar40 & 7) != 0) {
      uVar38 = (uint)((uVar40 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(this->super_InnerProduct).num_output / (int)uVar38,
              (ulong)uVar38 * (CONCAT44(uStack_124,local_128) / (ulong)(long)local_120),uVar38,
              opt->blob_allocator);
  pfVar49 = local_138;
  iVar35 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00315029;
  uVar38 = (this->super_InnerProduct).activation_type;
  uVar56 = local_120 * iStack_10c;
  iVar35 = top_blob->elempack;
  uVar40 = top_blob->w;
  pvVar24 = (this->super_InnerProduct).bias_data.data;
  if (iVar35 != 1) {
    if (iVar35 == 4) {
      if (0 < (int)uVar40) {
        uVar41 = 0;
        auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar227 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar217 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          fVar257 = 0.0;
          fVar260 = 0.0;
          fVar261 = 0.0;
          fVar262 = 0.0;
          if (pvVar24 != (void *)0x0) {
            pfVar49 = (float *)((long)pvVar24 + uVar41 * 0x10);
            fVar257 = *pfVar49;
            fVar260 = pfVar49[1];
            fVar261 = pfVar49[2];
            fVar262 = pfVar49[3];
          }
          pfVar49 = (float *)((long)(this->weight_data_tm).w * uVar41 *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          pfVar46 = local_138;
          if ((int)uVar56 < 8) {
            fVar271 = 0.0;
            fVar272 = 0.0;
            fVar273 = 0.0;
            fVar274 = 0.0;
            fVar275 = 0.0;
            fVar276 = 0.0;
            fVar139 = 0.0;
            fVar134 = 0.0;
            fVar135 = 0.0;
            fVar136 = 0.0;
            fVar137 = 0.0;
            fVar138 = 0.0;
            fVar267 = 0.0;
            fVar270 = 0.0;
            fVar263 = 0.0;
            fVar264 = 0.0;
            fVar265 = 0.0;
            fVar266 = 0.0;
            fVar91 = 0.0;
            fVar132 = 0.0;
            fVar133 = 0.0;
            auVar235 = ZEXT864(0);
            uVar52 = 0;
          }
          else {
            auVar235 = ZEXT864(0);
            iVar35 = 7;
            fVar263 = 0.0;
            fVar264 = 0.0;
            fVar265 = 0.0;
            fVar266 = 0.0;
            fVar91 = 0.0;
            fVar132 = 0.0;
            fVar133 = 0.0;
            fVar134 = 0.0;
            fVar135 = 0.0;
            fVar136 = 0.0;
            fVar137 = 0.0;
            fVar138 = 0.0;
            fVar267 = 0.0;
            fVar270 = 0.0;
            fVar271 = 0.0;
            fVar272 = 0.0;
            fVar273 = 0.0;
            fVar274 = 0.0;
            fVar275 = 0.0;
            fVar276 = 0.0;
            fVar139 = 0.0;
            do {
              fVar167 = *pfVar46;
              fVar168 = pfVar46[1];
              fVar169 = pfVar46[2];
              fVar170 = pfVar46[3];
              fVar171 = pfVar46[4];
              fVar172 = pfVar46[6];
              auVar235 = ZEXT3264(CONCAT428(fVar168 + auVar235._28_4_,
                                            CONCAT424(fVar168 * pfVar49[6] + auVar235._24_4_,
                                                      CONCAT420(fVar168 * pfVar49[5] +
                                                                auVar235._20_4_,
                                                                CONCAT416(fVar168 * pfVar49[4] +
                                                                          auVar235._16_4_,
                                                                          CONCAT412(fVar167 * 
                                                  pfVar49[3] + auVar235._12_4_,
                                                  CONCAT48(fVar167 * pfVar49[2] + auVar235._8_4_,
                                                           CONCAT44(fVar167 * pfVar49[1] +
                                                                    auVar235._4_4_,
                                                                    fVar167 * *pfVar49 +
                                                                    auVar235._0_4_))))))));
              fVar263 = fVar263 + fVar169 * pfVar49[8];
              fVar264 = fVar264 + fVar169 * pfVar49[9];
              fVar265 = fVar265 + fVar169 * pfVar49[10];
              fVar266 = fVar266 + fVar169 * pfVar49[0xb];
              fVar91 = fVar91 + fVar170 * pfVar49[0xc];
              fVar132 = fVar132 + fVar170 * pfVar49[0xe];
              fVar133 = fVar133 + fVar170;
              fVar134 = fVar171 * pfVar49[0x10] + fVar134;
              fVar135 = fVar171 * pfVar49[0x11] + fVar135;
              fVar136 = fVar171 * pfVar49[0x12] + fVar136;
              fVar137 = fVar171 * pfVar49[0x13] + fVar137;
              fVar138 = pfVar46[5] * pfVar49[0x14] + fVar138;
              fVar267 = pfVar46[5] * pfVar49[0x16] + fVar267;
              fVar270 = fVar168 + fVar270;
              fVar271 = fVar271 + fVar172 * pfVar49[0x18];
              fVar272 = fVar272 + fVar172 * pfVar49[0x19];
              fVar273 = fVar273 + fVar172 * pfVar49[0x1a];
              fVar274 = fVar274 + fVar172 * pfVar49[0x1b];
              fVar275 = fVar275 + pfVar46[7] * pfVar49[0x1c];
              fVar276 = fVar276 + pfVar46[7] * pfVar49[0x1e];
              fVar139 = fVar139 + fVar168;
              pfVar46 = pfVar46 + 8;
              pfVar49 = pfVar49 + 0x20;
              iVar35 = iVar35 + 8;
              uVar52 = uVar56 & 0xfffffff8;
            } while (iVar35 < (int)uVar56);
          }
          uVar51 = uVar52 | 3;
          while( true ) {
            if ((int)uVar56 <= (int)uVar51) break;
            fVar167 = *pfVar46;
            fVar168 = pfVar46[1];
            fVar169 = pfVar46[2];
            fVar170 = pfVar46[3];
            auVar235 = ZEXT3264(CONCAT428(fVar168 + auVar235._28_4_,
                                          CONCAT424(fVar168 * pfVar49[6] + auVar235._24_4_,
                                                    CONCAT420(fVar168 * pfVar49[5] + auVar235._20_4_
                                                              ,CONCAT416(fVar168 * pfVar49[4] +
                                                                         auVar235._16_4_,
                                                                         CONCAT412(fVar167 * pfVar49
                                                  [3] + auVar235._12_4_,
                                                  CONCAT48(fVar167 * pfVar49[2] + auVar235._8_4_,
                                                           CONCAT44(fVar167 * pfVar49[1] +
                                                                    auVar235._4_4_,
                                                                    fVar167 * *pfVar49 +
                                                                    auVar235._0_4_))))))));
            fVar263 = fVar263 + fVar169 * pfVar49[8];
            fVar264 = fVar264 + fVar169 * pfVar49[9];
            fVar265 = fVar265 + fVar169 * pfVar49[10];
            fVar266 = fVar266 + fVar169 * pfVar49[0xb];
            fVar91 = fVar91 + fVar170 * pfVar49[0xc];
            fVar132 = fVar132 + fVar170 * pfVar49[0xe];
            fVar133 = fVar133 + fVar170;
            pfVar46 = pfVar46 + 4;
            pfVar49 = pfVar49 + 0x10;
            uVar51 = uVar52 + 7;
            uVar52 = uVar52 + 4;
          }
          if (uVar56 - uVar52 != 0 && (int)uVar52 <= (int)uVar56) {
            lVar50 = 0;
            do {
              fVar167 = pfVar46[lVar50];
              fVar257 = fVar167 * *pfVar49 + fVar257;
              fVar260 = fVar167 * pfVar49[1] + fVar260;
              fVar261 = fVar167 * pfVar49[2] + fVar261;
              fVar262 = fVar167 * pfVar49[3] + fVar262;
              pfVar49 = pfVar49 + 4;
              lVar50 = lVar50 + 1;
            } while (uVar56 - uVar52 != (int)lVar50);
          }
          fVar264 = fVar272 + fVar135 + fVar264 + auVar235._4_4_;
          auVar176._0_4_ =
               fVar275 + fVar138 + fVar91 + auVar235._16_4_ +
               fVar271 + fVar134 + fVar263 + auVar235._0_4_ + fVar257;
          auVar176._4_4_ = fVar264 + fVar264 + fVar260;
          auVar176._8_4_ =
               fVar276 + fVar267 + fVar132 + auVar235._24_4_ +
               fVar273 + fVar136 + fVar265 + auVar235._8_4_ + fVar261;
          auVar176._12_4_ =
               fVar139 + fVar270 + fVar133 + auVar235._28_4_ +
               fVar274 + fVar137 + fVar266 + auVar235._12_4_ + fVar262;
          auVar218 = auVar90._0_16_;
          fVar263 = auVar227._0_4_;
          fVar264 = auVar227._4_4_;
          fVar265 = auVar227._8_4_;
          fVar266 = auVar227._12_4_;
          auVar251 = auVar217._0_16_;
          fVar257 = auVar217._0_4_;
          fVar260 = auVar217._4_4_;
          fVar261 = auVar217._8_4_;
          fVar262 = auVar217._12_4_;
          switch(uVar38) {
          case 1:
            auVar176 = vmaxps_avx(auVar176,auVar218);
            break;
          case 2:
            auVar251 = vmaxps_avx(auVar176,auVar218);
            auVar218 = vminps_avx(auVar176,auVar218);
            fVar257 = *(this->super_InnerProduct).activation_params.data;
            auVar176._0_4_ = fVar257 * auVar218._0_4_ + auVar251._0_4_;
            auVar176._4_4_ = fVar257 * auVar218._4_4_ + auVar251._4_4_;
            auVar176._8_4_ = fVar257 * auVar218._8_4_ + auVar251._8_4_;
            auVar176._12_4_ = fVar257 * auVar218._12_4_ + auVar251._12_4_;
            break;
          case 3:
            puVar25 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar12 = *puVar25;
            auVar93._4_4_ = uVar12;
            auVar93._0_4_ = uVar12;
            auVar93._8_4_ = uVar12;
            auVar93._12_4_ = uVar12;
            uVar12 = puVar25[1];
            auVar149._4_4_ = uVar12;
            auVar149._0_4_ = uVar12;
            auVar149._8_4_ = uVar12;
            auVar149._12_4_ = uVar12;
            auVar176 = vmaxps_avx(auVar176,auVar93);
            auVar176 = vminps_avx(auVar176,auVar149);
            break;
          case 4:
            uVar47 = CONCAT44(auVar176._4_4_,auVar176._0_4_);
            auVar65._0_8_ = uVar47 ^ 0x8000000080000000;
            auVar65._8_4_ = -auVar176._8_4_;
            auVar65._12_4_ = -auVar176._12_4_;
            auVar94._8_4_ = 0x42b0c0a5;
            auVar94._0_8_ = 0x42b0c0a542b0c0a5;
            auVar94._12_4_ = 0x42b0c0a5;
            auVar176 = vminps_avx(auVar65,auVar94);
            auVar95._8_4_ = 0xc2b0c0a5;
            auVar95._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar95._12_4_ = 0xc2b0c0a5;
            auVar180 = vmaxps_avx(auVar176,auVar95);
            auVar96._0_4_ = fVar263 + auVar180._0_4_ * 1.442695;
            auVar96._4_4_ = fVar264 + auVar180._4_4_ * 1.442695;
            auVar96._8_4_ = fVar265 + auVar180._8_4_ * 1.442695;
            auVar96._12_4_ = fVar266 + auVar180._12_4_ * 1.442695;
            auVar150._0_4_ = (int)auVar96._0_4_;
            auVar150._4_4_ = (int)auVar96._4_4_;
            auVar150._8_4_ = (int)auVar96._8_4_;
            auVar150._12_4_ = (int)auVar96._12_4_;
            auVar218 = vcvtdq2ps_avx(auVar150);
            auVar176 = vcmpps_avx(auVar96,auVar218,1);
            auVar176 = vandps_avx(auVar176,auVar251);
            auVar176 = vsubps_avx(auVar218,auVar176);
            fVar91 = auVar180._0_4_ + auVar176._0_4_ * -0.6931472;
            fVar132 = auVar180._4_4_ + auVar176._4_4_ * -0.6931472;
            fVar133 = auVar180._8_4_ + auVar176._8_4_ * -0.6931472;
            fVar134 = auVar180._12_4_ + auVar176._12_4_ * -0.6931472;
            auVar97._0_4_ = (int)auVar176._0_4_;
            auVar97._4_4_ = (int)auVar176._4_4_;
            auVar97._8_4_ = (int)auVar176._8_4_;
            auVar97._12_4_ = (int)auVar176._12_4_;
            auVar176 = vpslld_avx(auVar97,0x17);
            auVar176 = vpaddd_avx(auVar176,auVar251);
            auVar66._0_4_ =
                 (fVar91 + fVar257 +
                 fVar91 * fVar91 *
                 (fVar263 +
                 ((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                  0.041665796) * fVar91 + 0.16666666) * fVar91)) * auVar176._0_4_ + fVar257;
            auVar66._4_4_ =
                 (fVar132 + fVar260 +
                 fVar132 * fVar132 *
                 (fVar264 +
                 ((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                  0.041665796) * fVar132 + 0.16666666) * fVar132)) * auVar176._4_4_ + fVar260;
            auVar66._8_4_ =
                 (fVar133 + fVar261 +
                 fVar133 * fVar133 *
                 (fVar265 +
                 ((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                  0.041665796) * fVar133 + 0.16666666) * fVar133)) * auVar176._8_4_ + fVar261;
            auVar66._12_4_ =
                 (fVar134 + fVar262 +
                 fVar134 * fVar134 *
                 (fVar266 +
                 ((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                  0.041665796) * fVar134 + 0.16666666) * fVar134)) * auVar176._12_4_ + fVar262;
            auVar176 = vdivps_avx(auVar251,auVar66);
            break;
          case 5:
            auVar237._8_4_ = 0x42b0c0a5;
            auVar237._0_8_ = 0x42b0c0a542b0c0a5;
            auVar237._12_4_ = 0x42b0c0a5;
            auVar218 = vminps_avx(auVar237,auVar176);
            auVar243._8_4_ = 0xc2b0c0a5;
            auVar243._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar243._12_4_ = 0xc2b0c0a5;
            auVar142 = vmaxps_avx(auVar243,auVar218);
            auVar141._0_4_ = fVar263 + auVar142._0_4_ * 1.442695;
            auVar141._4_4_ = fVar264 + auVar142._4_4_ * 1.442695;
            auVar141._8_4_ = fVar265 + auVar142._8_4_ * 1.442695;
            auVar141._12_4_ = fVar266 + auVar142._12_4_ * 1.442695;
            auVar178._0_4_ = (int)auVar141._0_4_;
            auVar178._4_4_ = (int)auVar141._4_4_;
            auVar178._8_4_ = (int)auVar141._8_4_;
            auVar178._12_4_ = (int)auVar141._12_4_;
            auVar180 = vcvtdq2ps_avx(auVar178);
            auVar218 = vcmpps_avx(auVar141,auVar180,1);
            auVar218 = vandps_avx(auVar218,auVar251);
            auVar218 = vsubps_avx(auVar180,auVar218);
            auVar179._0_4_ = auVar218._0_4_ * 0.6931472;
            auVar179._4_4_ = auVar218._4_4_ * 0.6931472;
            auVar179._8_4_ = auVar218._8_4_ * 0.6931472;
            auVar179._12_4_ = auVar218._12_4_ * 0.6931472;
            auVar180 = vsubps_avx(auVar142,auVar179);
            fVar91 = auVar180._0_4_;
            fVar132 = auVar180._4_4_;
            fVar133 = auVar180._8_4_;
            fVar134 = auVar180._12_4_;
            auVar142._0_4_ = (int)auVar218._0_4_;
            auVar142._4_4_ = (int)auVar218._4_4_;
            auVar142._8_4_ = (int)auVar218._8_4_;
            auVar142._12_4_ = (int)auVar218._12_4_;
            auVar218 = vpslld_avx(auVar142,0x17);
            auVar218 = vpaddd_avx(auVar218,auVar251);
            auVar92._0_4_ =
                 (fVar91 + fVar257 +
                 fVar91 * fVar91 *
                 (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                   0.041665796) * fVar91 + 0.16666666) * fVar91 + fVar263)) * auVar218._0_4_ +
                 fVar257;
            auVar92._4_4_ =
                 (fVar132 + fVar260 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + fVar264)) * auVar218._4_4_ +
                 fVar260;
            auVar92._8_4_ =
                 (fVar133 + fVar261 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + fVar265)) * auVar218._8_4_ +
                 fVar261;
            auVar92._12_4_ =
                 (fVar134 + fVar262 +
                 fVar134 * fVar134 *
                 (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + fVar266)) * auVar218._12_4_ +
                 fVar262;
            auVar143._8_4_ = 0x800000;
            auVar143._0_8_ = 0x80000000800000;
            auVar143._12_4_ = 0x800000;
            auVar218 = vmaxps_avx(auVar92,auVar143);
            auVar180 = vpsrld_avx(auVar218,0x17);
            auVar219._8_4_ = 0xffffff82;
            auVar219._0_8_ = 0xffffff82ffffff82;
            auVar219._12_4_ = 0xffffff82;
            auVar180 = vpaddd_avx(auVar180,auVar219);
            auVar220._8_4_ = 0x807fffff;
            auVar220._0_8_ = 0x807fffff807fffff;
            auVar220._12_4_ = 0x807fffff;
            auVar218 = vandps_avx(auVar218,auVar220);
            auVar141 = vorps_avx(auVar218,auVar227._0_16_);
            auVar142 = vcvtdq2ps_avx(auVar180);
            auVar221._8_4_ = 0x3f3504f3;
            auVar221._0_8_ = 0x3f3504f33f3504f3;
            auVar221._12_4_ = 0x3f3504f3;
            auVar180 = vcmpps_avx(auVar141,auVar221,1);
            auVar218 = vandps_avx(auVar180,auVar141);
            fVar91 = auVar218._0_4_ + auVar141._0_4_ + -1.0;
            fVar132 = auVar218._4_4_ + auVar141._4_4_ + -1.0;
            fVar133 = auVar218._8_4_ + auVar141._8_4_ + -1.0;
            fVar134 = auVar218._12_4_ + auVar141._12_4_ + -1.0;
            auVar218 = vandps_avx(auVar180,auVar251);
            auVar180 = vsubps_avx(auVar142,auVar218);
            auVar218 = vcmpps_avx(auVar92,_DAT_005ef030,2);
            auVar227 = ZEXT1664(auVar227._0_16_);
            auVar144._0_4_ =
                 (auVar180._0_4_ * 0.6931472 + fVar91 +
                 (((((((((fVar91 * 0.070376836 + -0.1151461) * fVar91 + 0.116769984) * fVar91 +
                       -0.12420141) * fVar91 + 0.14249323) * fVar91 + -0.16668057) * fVar91 +
                    0.20000714) * fVar91 + -0.24999994) * fVar91 + 0.3333333) * fVar91 + -0.5) *
                 fVar91 * fVar91) * -2.0;
            auVar144._4_4_ =
                 (auVar180._4_4_ * 0.6931472 + fVar132 +
                 (((((((((fVar132 * 0.070376836 + -0.1151461) * fVar132 + 0.116769984) * fVar132 +
                       -0.12420141) * fVar132 + 0.14249323) * fVar132 + -0.16668057) * fVar132 +
                    0.20000714) * fVar132 + -0.24999994) * fVar132 + 0.3333333) * fVar132 + -0.5) *
                 fVar132 * fVar132) * -2.0;
            auVar144._8_4_ =
                 (auVar180._8_4_ * 0.6931472 + fVar133 +
                 (((((((((fVar133 * 0.070376836 + -0.1151461) * fVar133 + 0.116769984) * fVar133 +
                       -0.12420141) * fVar133 + 0.14249323) * fVar133 + -0.16668057) * fVar133 +
                    0.20000714) * fVar133 + -0.24999994) * fVar133 + 0.3333333) * fVar133 + -0.5) *
                 fVar133 * fVar133) * -2.0;
            auVar144._12_4_ =
                 (auVar180._12_4_ * 0.6931472 + fVar134 +
                 (((((((((fVar134 * 0.070376836 + -0.1151461) * fVar134 + 0.116769984) * fVar134 +
                       -0.12420141) * fVar134 + 0.14249323) * fVar134 + -0.16668057) * fVar134 +
                    0.20000714) * fVar134 + -0.24999994) * fVar134 + 0.3333333) * fVar134 + -0.5) *
                 fVar134 * fVar134) * -2.0;
            auVar181._8_4_ = 0x7fffffff;
            auVar181._0_8_ = 0x7fffffff7fffffff;
            auVar181._12_4_ = 0x7fffffff;
            auVar218 = vblendvps_avx(auVar144,auVar181,auVar218);
            auVar145._8_4_ = 0x42b0c0a5;
            auVar145._0_8_ = 0x42b0c0a542b0c0a5;
            auVar145._12_4_ = 0x42b0c0a5;
            auVar218 = vminps_avx(auVar218,auVar145);
            auVar142 = vmaxps_avx(auVar243,auVar218);
            auVar146._0_4_ = auVar142._0_4_ * 1.442695 + fVar263;
            auVar146._4_4_ = auVar142._4_4_ * 1.442695 + fVar264;
            auVar146._8_4_ = auVar142._8_4_ * 1.442695 + fVar265;
            auVar146._12_4_ = auVar142._12_4_ * 1.442695 + fVar266;
            auVar182._0_4_ = (int)auVar146._0_4_;
            auVar182._4_4_ = (int)auVar146._4_4_;
            auVar182._8_4_ = (int)auVar146._8_4_;
            auVar182._12_4_ = (int)auVar146._12_4_;
            auVar180 = vcvtdq2ps_avx(auVar182);
            auVar218 = vcmpps_avx(auVar146,auVar180,1);
            auVar218 = vandps_avx(auVar218,auVar251);
            auVar218 = vsubps_avx(auVar180,auVar218);
            auVar183._0_4_ = auVar218._0_4_ * 0.6931472;
            auVar183._4_4_ = auVar218._4_4_ * 0.6931472;
            auVar183._8_4_ = auVar218._8_4_ * 0.6931472;
            auVar183._12_4_ = auVar218._12_4_ * 0.6931472;
            auVar217 = ZEXT1664(auVar251);
            auVar180 = vsubps_avx(auVar142,auVar183);
            fVar91 = auVar180._0_4_;
            fVar132 = auVar180._4_4_;
            fVar133 = auVar180._8_4_;
            fVar134 = auVar180._12_4_;
            auVar90 = ZEXT864(0) << 0x20;
            auVar147._0_4_ = (int)auVar218._0_4_;
            auVar147._4_4_ = (int)auVar218._4_4_;
            auVar147._8_4_ = (int)auVar218._8_4_;
            auVar147._12_4_ = (int)auVar218._12_4_;
            auVar218 = vpslld_avx(auVar147,0x17);
            auVar218 = vpaddd_avx(auVar218,auVar251);
            auVar251._0_4_ =
                 (fVar91 + fVar257 +
                 fVar91 * fVar91 *
                 (fVar263 +
                 ((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                  0.041665796) * fVar91 + 0.16666666) * fVar91)) * auVar218._0_4_ + fVar257;
            auVar251._4_4_ =
                 (fVar132 + fVar260 +
                 fVar132 * fVar132 *
                 (fVar264 +
                 ((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                  0.041665796) * fVar132 + 0.16666666) * fVar132)) * auVar218._4_4_ + fVar260;
            auVar251._8_4_ =
                 (fVar133 + fVar261 +
                 fVar133 * fVar133 *
                 (fVar265 +
                 ((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                  0.041665796) * fVar133 + 0.16666666) * fVar133)) * auVar218._8_4_ + fVar261;
            auVar251._12_4_ =
                 (fVar134 + fVar262 +
                 fVar134 * fVar134 *
                 (fVar266 +
                 ((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                  0.041665796) * fVar134 + 0.16666666) * fVar134)) * auVar218._12_4_ + fVar262;
            auVar148._8_4_ = 0x40000000;
            auVar148._0_8_ = 0x4000000040000000;
            auVar148._12_4_ = 0x40000000;
            auVar251 = vdivps_avx(auVar148,auVar251);
            auVar218._0_4_ = auVar251._0_4_ + -1.0;
            auVar218._4_4_ = auVar251._4_4_ + -1.0;
            auVar218._8_4_ = auVar251._8_4_ + -1.0;
            auVar218._12_4_ = auVar251._12_4_ + -1.0;
            goto LAB_00313cb6;
          case 6:
            pfVar49 = (float *)(this->super_InnerProduct).activation_params.data;
            fVar257 = *pfVar49;
            fVar260 = pfVar49[1];
            auVar180._0_4_ = fVar257 * auVar176._0_4_ + fVar260;
            auVar180._4_4_ = fVar257 * auVar176._4_4_ + fVar260;
            auVar180._8_4_ = fVar257 * auVar176._8_4_ + fVar260;
            auVar180._12_4_ = fVar257 * auVar176._12_4_ + fVar260;
            auVar218 = vmaxps_avx(auVar180,auVar218);
            auVar218 = vminps_avx(auVar218,auVar251);
LAB_00313cb6:
            auVar176._0_4_ = auVar218._0_4_ * auVar176._0_4_;
            auVar176._4_4_ = auVar218._4_4_ * auVar176._4_4_;
            auVar176._8_4_ = auVar218._8_4_ * auVar176._8_4_;
            auVar176._12_4_ = auVar218._12_4_ * auVar176._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar41 * 0x10) = auVar176;
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar40);
      }
    }
    else if ((iVar35 == 8) && (0 < (int)uVar40)) {
      uVar41 = 0;
      auVar217 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar90 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      do {
        fVar261 = 0.0;
        fVar262 = 0.0;
        fVar257 = 0.0;
        fVar260 = 0.0;
        fVar263 = 0.0;
        fVar264 = 0.0;
        fVar265 = 0.0;
        fVar266 = 0.0;
        if (pvVar24 != (void *)0x0) {
          pfVar49 = (float *)((long)pvVar24 + uVar41 * 0x20);
          fVar257 = *pfVar49;
          fVar260 = pfVar49[1];
          fVar261 = pfVar49[2];
          fVar262 = pfVar49[3];
          fVar263 = pfVar49[4];
          fVar264 = pfVar49[5];
          fVar265 = pfVar49[6];
          fVar266 = pfVar49[7];
        }
        pfVar49 = (float *)((long)(this->weight_data_tm).w * uVar41 *
                            (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pfVar46 = local_138;
        if ((int)uVar56 < 8) {
          fVar139 = 0.0;
          fVar167 = 0.0;
          fVar168 = 0.0;
          fVar169 = 0.0;
          fVar170 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          auVar238 = SUB6432(ZEXT864(0),0);
          fVar174 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar201 = 0.0;
          fVar202 = 0.0;
          fVar203 = 0.0;
          fVar204 = 0.0;
          auVar233 = SUB6432(ZEXT864(0),0);
          fVar267 = 0.0;
          fVar270 = 0.0;
          fVar271 = 0.0;
          fVar272 = 0.0;
          fVar273 = 0.0;
          fVar274 = 0.0;
          fVar275 = 0.0;
          fVar276 = 0.0;
          fVar91 = 0.0;
          fVar132 = 0.0;
          fVar133 = 0.0;
          fVar134 = 0.0;
          fVar135 = 0.0;
          fVar136 = 0.0;
          fVar137 = 0.0;
          fVar138 = 0.0;
          auVar227 = ZEXT864(0);
          uVar52 = 0;
        }
        else {
          auVar227 = ZEXT864(0);
          iVar35 = 7;
          fVar91 = 0.0;
          fVar132 = 0.0;
          fVar133 = 0.0;
          fVar134 = 0.0;
          fVar135 = 0.0;
          fVar136 = 0.0;
          fVar137 = 0.0;
          fVar138 = 0.0;
          fVar267 = 0.0;
          fVar270 = 0.0;
          fVar271 = 0.0;
          fVar272 = 0.0;
          fVar273 = 0.0;
          fVar274 = 0.0;
          fVar275 = 0.0;
          fVar276 = 0.0;
          auVar235 = ZEXT864(0);
          fVar174 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar201 = 0.0;
          fVar202 = 0.0;
          fVar203 = 0.0;
          fVar204 = 0.0;
          auVar241 = ZEXT864(0);
          fVar139 = 0.0;
          fVar167 = 0.0;
          fVar168 = 0.0;
          fVar169 = 0.0;
          fVar170 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          do {
            fVar8 = *pfVar46;
            fVar9 = pfVar46[1];
            fVar10 = pfVar46[2];
            fVar11 = pfVar46[3];
            fVar257 = fVar8 * *pfVar49 + fVar257;
            fVar260 = fVar8 * pfVar49[1] + fVar260;
            fVar261 = fVar8 * pfVar49[2] + fVar261;
            fVar262 = fVar8 * pfVar49[3] + fVar262;
            fVar263 = fVar8 * pfVar49[4] + fVar263;
            fVar264 = fVar8 * pfVar49[5] + fVar264;
            fVar265 = fVar8 * pfVar49[6] + fVar265;
            fVar266 = fVar8 + fVar266;
            auVar227 = ZEXT3264(CONCAT428(fVar9 + auVar227._28_4_,
                                          CONCAT424(fVar9 * pfVar49[0xe] + auVar227._24_4_,
                                                    CONCAT420(fVar9 * pfVar49[0xd] + auVar227._20_4_
                                                              ,CONCAT416(fVar9 * pfVar49[0xc] +
                                                                         auVar227._16_4_,
                                                                         CONCAT412(fVar9 * pfVar49[
                                                  0xb] + auVar227._12_4_,
                                                  CONCAT48(fVar9 * pfVar49[10] + auVar227._8_4_,
                                                           CONCAT44(fVar9 * pfVar49[9] +
                                                                    auVar227._4_4_,
                                                                    fVar9 * pfVar49[8] +
                                                                    auVar227._0_4_))))))));
            fVar91 = fVar10 * pfVar49[0x10] + fVar91;
            fVar132 = fVar10 * pfVar49[0x11] + fVar132;
            fVar133 = fVar10 * pfVar49[0x12] + fVar133;
            fVar134 = fVar10 * pfVar49[0x13] + fVar134;
            fVar135 = fVar10 * pfVar49[0x14] + fVar135;
            fVar136 = fVar10 * pfVar49[0x15] + fVar136;
            fVar137 = fVar10 * pfVar49[0x16] + fVar137;
            fVar138 = fVar8 + fVar138;
            fVar267 = fVar11 * pfVar49[0x18] + fVar267;
            fVar270 = fVar11 * pfVar49[0x19] + fVar270;
            fVar271 = fVar11 * pfVar49[0x1a] + fVar271;
            fVar272 = fVar11 * pfVar49[0x1b] + fVar272;
            fVar273 = fVar11 * pfVar49[0x1c] + fVar273;
            fVar274 = fVar11 * pfVar49[0x1d] + fVar274;
            fVar275 = fVar11 * pfVar49[0x1e] + fVar275;
            fVar276 = fVar8 + fVar276;
            fVar8 = pfVar46[4];
            fVar9 = pfVar46[5];
            fVar10 = pfVar46[6];
            fVar11 = pfVar46[7];
            auVar233._0_4_ = fVar8 * pfVar49[0x20] + auVar235._0_4_;
            auVar233._4_4_ = fVar8 * pfVar49[0x21] + auVar235._4_4_;
            auVar233._8_4_ = fVar8 * pfVar49[0x22] + auVar235._8_4_;
            auVar233._12_4_ = fVar8 * pfVar49[0x23] + auVar235._12_4_;
            auVar233._16_4_ = fVar8 * pfVar49[0x24] + auVar235._16_4_;
            auVar233._20_4_ = fVar8 * pfVar49[0x25] + auVar235._20_4_;
            auVar233._24_4_ = fVar8 * pfVar49[0x26] + auVar235._24_4_;
            auVar233._28_4_ = fVar8 + auVar235._28_4_;
            auVar235 = ZEXT3264(auVar233);
            fVar174 = fVar9 * pfVar49[0x28] + fVar174;
            fVar198 = fVar9 * pfVar49[0x29] + fVar198;
            fVar199 = fVar9 * pfVar49[0x2a] + fVar199;
            fVar200 = fVar9 * pfVar49[0x2b] + fVar200;
            fVar201 = fVar9 * pfVar49[0x2c] + fVar201;
            fVar202 = fVar9 * pfVar49[0x2d] + fVar202;
            fVar203 = fVar9 * pfVar49[0x2e] + fVar203;
            fVar204 = fVar9 + fVar204;
            auVar238._0_4_ = fVar10 * pfVar49[0x30] + auVar241._0_4_;
            auVar238._4_4_ = fVar10 * pfVar49[0x31] + auVar241._4_4_;
            auVar238._8_4_ = fVar10 * pfVar49[0x32] + auVar241._8_4_;
            auVar238._12_4_ = fVar10 * pfVar49[0x33] + auVar241._12_4_;
            auVar238._16_4_ = fVar10 * pfVar49[0x34] + auVar241._16_4_;
            auVar238._20_4_ = fVar10 * pfVar49[0x35] + auVar241._20_4_;
            auVar238._24_4_ = fVar10 * pfVar49[0x36] + auVar241._24_4_;
            auVar238._28_4_ = fVar8 + auVar241._28_4_;
            auVar241 = ZEXT3264(auVar238);
            fVar139 = fVar11 * pfVar49[0x38] + fVar139;
            fVar167 = fVar11 * pfVar49[0x39] + fVar167;
            fVar168 = fVar11 * pfVar49[0x3a] + fVar168;
            fVar169 = fVar11 * pfVar49[0x3b] + fVar169;
            fVar170 = fVar11 * pfVar49[0x3c] + fVar170;
            fVar171 = fVar11 * pfVar49[0x3d] + fVar171;
            fVar172 = fVar11 * pfVar49[0x3e] + fVar172;
            fVar173 = fVar8 + fVar173;
            pfVar46 = pfVar46 + 8;
            pfVar49 = pfVar49 + 0x40;
            iVar35 = iVar35 + 8;
            uVar52 = uVar56 & 0xfffffff8;
          } while (iVar35 < (int)uVar56);
        }
        uVar51 = uVar52 | 3;
        while( true ) {
          if ((int)uVar56 <= (int)uVar51) break;
          fVar8 = *pfVar46;
          fVar9 = pfVar46[1];
          fVar10 = pfVar46[2];
          fVar11 = pfVar46[3];
          fVar257 = fVar8 * *pfVar49 + fVar257;
          fVar260 = fVar8 * pfVar49[1] + fVar260;
          fVar261 = fVar8 * pfVar49[2] + fVar261;
          fVar262 = fVar8 * pfVar49[3] + fVar262;
          fVar263 = fVar8 * pfVar49[4] + fVar263;
          fVar264 = fVar8 * pfVar49[5] + fVar264;
          fVar265 = fVar8 * pfVar49[6] + fVar265;
          fVar266 = fVar8 + fVar266;
          auVar227 = ZEXT3264(CONCAT428(fVar8 + auVar227._28_4_,
                                        CONCAT424(fVar9 * pfVar49[0xe] + auVar227._24_4_,
                                                  CONCAT420(fVar9 * pfVar49[0xd] + auVar227._20_4_,
                                                            CONCAT416(fVar9 * pfVar49[0xc] +
                                                                      auVar227._16_4_,
                                                                      CONCAT412(fVar9 * pfVar49[0xb]
                                                                                + auVar227._12_4_,
                                                                                CONCAT48(fVar9 * 
                                                  pfVar49[10] + auVar227._8_4_,
                                                  CONCAT44(fVar9 * pfVar49[9] + auVar227._4_4_,
                                                           fVar9 * pfVar49[8] + auVar227._0_4_))))))
                                       ));
          fVar91 = fVar10 * pfVar49[0x10] + fVar91;
          fVar132 = fVar10 * pfVar49[0x11] + fVar132;
          fVar133 = fVar10 * pfVar49[0x12] + fVar133;
          fVar134 = fVar10 * pfVar49[0x13] + fVar134;
          fVar135 = fVar10 * pfVar49[0x14] + fVar135;
          fVar136 = fVar10 * pfVar49[0x15] + fVar136;
          fVar137 = fVar10 * pfVar49[0x16] + fVar137;
          fVar138 = fVar8 + fVar138;
          fVar267 = fVar11 * pfVar49[0x18] + fVar267;
          fVar270 = fVar11 * pfVar49[0x19] + fVar270;
          fVar271 = fVar11 * pfVar49[0x1a] + fVar271;
          fVar272 = fVar11 * pfVar49[0x1b] + fVar272;
          fVar273 = fVar11 * pfVar49[0x1c] + fVar273;
          fVar274 = fVar11 * pfVar49[0x1d] + fVar274;
          fVar275 = fVar11 * pfVar49[0x1e] + fVar275;
          fVar276 = fVar9 + fVar276;
          pfVar46 = pfVar46 + 4;
          pfVar49 = pfVar49 + 0x20;
          uVar51 = uVar52 + 7;
          uVar52 = uVar52 + 4;
        }
        if (uVar56 - uVar52 != 0 && (int)uVar52 <= (int)uVar56) {
          lVar50 = 0;
          do {
            fVar8 = pfVar46[lVar50];
            fVar257 = fVar8 * *pfVar49 + fVar257;
            fVar260 = fVar8 * pfVar49[1] + fVar260;
            fVar261 = fVar8 * pfVar49[2] + fVar261;
            fVar262 = fVar8 * pfVar49[3] + fVar262;
            fVar263 = fVar8 * pfVar49[4] + fVar263;
            fVar264 = fVar8 * pfVar49[5] + fVar264;
            fVar265 = fVar8 * pfVar49[6] + fVar265;
            fVar266 = fVar8 + fVar266;
            pfVar49 = pfVar49 + 8;
            lVar50 = lVar50 + 1;
          } while (uVar56 - uVar52 != (int)lVar50);
        }
        fVar204 = auVar233._28_4_ + fVar204;
        fVar257 = fVar257 + auVar238._0_4_ + fVar139 + auVar233._0_4_ + fVar174 +
                            fVar267 + fVar91 + auVar227._0_4_;
        fVar260 = fVar260 + auVar238._4_4_ + fVar167 + auVar233._4_4_ + fVar198 +
                            fVar270 + fVar132 + auVar227._4_4_;
        auVar113._0_8_ = CONCAT44(fVar260,fVar257);
        auVar113._8_4_ =
             fVar261 + auVar238._8_4_ + fVar168 + auVar233._8_4_ + fVar199 +
                       fVar271 + fVar133 + auVar227._8_4_;
        auVar113._12_4_ =
             fVar262 + auVar238._12_4_ + fVar169 + auVar233._12_4_ + fVar200 +
                       fVar272 + fVar134 + auVar227._12_4_;
        auVar113._16_4_ =
             fVar263 + auVar238._16_4_ + fVar170 + auVar233._16_4_ + fVar201 +
                       fVar273 + fVar135 + auVar227._16_4_;
        auVar113._20_4_ =
             fVar264 + auVar238._20_4_ + fVar171 + auVar233._20_4_ + fVar202 +
                       fVar274 + fVar136 + auVar227._20_4_;
        auVar113._24_4_ =
             fVar265 + auVar238._24_4_ + fVar172 + auVar233._24_4_ + fVar203 +
                       fVar275 + fVar137 + auVar227._24_4_;
        auVar113._28_4_ =
             fVar266 + auVar238._28_4_ + fVar173 + fVar204 + fVar276 + fVar138 + auVar227._28_4_;
        auVar81 = auVar90._0_32_;
        fVar264 = auVar217._4_4_;
        fVar266 = auVar217._8_4_;
        fVar91 = auVar217._12_4_;
        fVar134 = auVar217._16_4_;
        fVar135 = auVar217._20_4_;
        fVar137 = auVar217._24_4_;
        fVar270 = auVar217._28_4_;
        fVar261 = auVar90._0_4_;
        fVar263 = auVar90._4_4_;
        fVar265 = auVar90._8_4_;
        fVar132 = auVar90._12_4_;
        fVar133 = auVar90._16_4_;
        fVar136 = auVar90._20_4_;
        fVar138 = auVar90._24_4_;
        fVar267 = auVar90._28_4_;
        fVar262 = auVar217._0_4_;
        switch(uVar38) {
        case 1:
          auVar113 = vmaxps_avx(auVar113,_DAT_005f3660);
          break;
        case 2:
          auVar81 = vmaxps_avx(auVar113,ZEXT1632(ZEXT816(0) << 0x40));
          auVar233 = vminps_avx(auVar113,ZEXT1632(ZEXT816(0) << 0x40));
          fVar257 = *(this->super_InnerProduct).activation_params.data;
          auVar113._0_4_ = fVar257 * auVar233._0_4_ + auVar81._0_4_;
          auVar113._4_4_ = fVar257 * auVar233._4_4_ + auVar81._4_4_;
          auVar113._8_4_ = fVar257 * auVar233._8_4_ + auVar81._8_4_;
          auVar113._12_4_ = fVar257 * auVar233._12_4_ + auVar81._12_4_;
          auVar113._16_4_ = fVar257 * auVar233._16_4_ + auVar81._16_4_;
          auVar113._20_4_ = fVar257 * auVar233._20_4_ + auVar81._20_4_;
          auVar113._24_4_ = fVar257 * auVar233._24_4_ + auVar81._24_4_;
          auVar113._28_4_ = auVar233._28_4_ + auVar81._28_4_;
          break;
        case 3:
          puVar25 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar12 = *puVar25;
          auVar157._4_4_ = uVar12;
          auVar157._0_4_ = uVar12;
          auVar157._8_4_ = uVar12;
          auVar157._12_4_ = uVar12;
          auVar157._16_4_ = uVar12;
          auVar157._20_4_ = uVar12;
          auVar157._24_4_ = uVar12;
          auVar157._28_4_ = uVar12;
          uVar12 = puVar25[1];
          auVar195._4_4_ = uVar12;
          auVar195._0_4_ = uVar12;
          auVar195._8_4_ = uVar12;
          auVar195._12_4_ = uVar12;
          auVar195._16_4_ = uVar12;
          auVar195._20_4_ = uVar12;
          auVar195._24_4_ = uVar12;
          auVar195._28_4_ = uVar12;
          auVar81 = vmaxps_avx(auVar113,auVar157);
          auVar113 = vminps_avx(auVar81,auVar195);
          break;
        case 4:
          auVar114._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
          auVar114._8_4_ = -auVar113._8_4_;
          auVar114._12_4_ = -auVar113._12_4_;
          auVar114._16_4_ = -auVar113._16_4_;
          auVar114._20_4_ = -auVar113._20_4_;
          auVar114._24_4_ = -auVar113._24_4_;
          auVar114._28_4_ = -auVar113._28_4_;
          auVar158._8_4_ = 0x42b0c0a5;
          auVar158._0_8_ = 0x42b0c0a542b0c0a5;
          auVar158._12_4_ = 0x42b0c0a5;
          auVar158._16_4_ = 0x42b0c0a5;
          auVar158._20_4_ = 0x42b0c0a5;
          auVar158._24_4_ = 0x42b0c0a5;
          auVar158._28_4_ = 0x42b0c0a5;
          auVar233 = vminps_avx(auVar114,auVar158);
          auVar159._8_4_ = 0xc2b0c0a5;
          auVar159._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar159._12_4_ = 0xc2b0c0a5;
          auVar159._16_4_ = 0xc2b0c0a5;
          auVar159._20_4_ = 0xc2b0c0a5;
          auVar159._24_4_ = 0xc2b0c0a5;
          auVar159._28_4_ = 0xc2b0c0a5;
          auVar238 = vmaxps_avx(auVar233,auVar159);
          auVar160._0_4_ = auVar238._0_4_ * 1.442695 + fVar262;
          auVar160._4_4_ = auVar238._4_4_ * 1.442695 + fVar264;
          auVar160._8_4_ = auVar238._8_4_ * 1.442695 + fVar266;
          auVar160._12_4_ = auVar238._12_4_ * 1.442695 + fVar91;
          auVar160._16_4_ = auVar238._16_4_ * 1.442695 + fVar134;
          auVar160._20_4_ = auVar238._20_4_ * 1.442695 + fVar135;
          auVar160._24_4_ = auVar238._24_4_ * 1.442695 + fVar137;
          auVar160._28_4_ = fVar270 + 1.442695;
          auVar113 = vroundps_avx(auVar160,1);
          auVar233 = vcmpps_avx(auVar160,auVar113,1);
          auVar233 = vandps_avx(auVar233,auVar81);
          auVar233 = vsubps_avx(auVar113,auVar233);
          fVar257 = auVar238._0_4_ + auVar233._0_4_ * -0.6931472;
          fVar260 = auVar238._4_4_ + auVar233._4_4_ * -0.6931472;
          fVar270 = auVar238._8_4_ + auVar233._8_4_ * -0.6931472;
          fVar271 = auVar238._12_4_ + auVar233._12_4_ * -0.6931472;
          fVar272 = auVar238._16_4_ + auVar233._16_4_ * -0.6931472;
          fVar273 = auVar238._20_4_ + auVar233._20_4_ * -0.6931472;
          fVar274 = auVar238._24_4_ + auVar233._24_4_ * -0.6931472;
          auVar140._0_4_ = (int)auVar233._0_4_;
          auVar140._4_4_ = (int)auVar233._4_4_;
          auVar140._8_4_ = (int)auVar233._8_4_;
          auVar140._12_4_ = (int)auVar233._12_4_;
          auVar161._16_4_ = (int)auVar233._16_4_;
          auVar161._0_16_ = auVar140;
          auVar161._20_4_ = (int)auVar233._20_4_;
          auVar161._24_4_ = (int)auVar233._24_4_;
          auVar161._28_4_ = (int)auVar233._28_4_;
          auVar218 = vpslld_avx(auVar140,0x17);
          auVar176 = vpslld_avx(auVar161._16_16_,0x17);
          auVar57._8_4_ = 0x3f800000;
          auVar57._0_8_ = 0x3f8000003f800000;
          auVar57._12_4_ = 0x3f800000;
          auVar176 = vpaddd_avx(auVar176,auVar57);
          auVar218 = vpaddd_avx(auVar218,auVar57);
          auVar115._0_4_ =
               (fVar257 + fVar261 +
               fVar257 * fVar257 *
               (((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257 +
                 0.041665796) * fVar257 + 0.16666666) * fVar257 + fVar262)) * auVar218._0_4_ +
               fVar261;
          auVar115._4_4_ =
               (fVar260 + fVar263 +
               fVar260 * fVar260 *
               (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                 0.041665796) * fVar260 + 0.16666666) * fVar260 + fVar264)) * auVar218._4_4_ +
               fVar263;
          auVar115._8_4_ =
               (fVar270 + fVar265 +
               fVar270 * fVar270 *
               (((((fVar270 * 0.00019875691 + 0.0013981999) * fVar270 + 0.008333452) * fVar270 +
                 0.041665796) * fVar270 + 0.16666666) * fVar270 + fVar266)) * auVar218._8_4_ +
               fVar265;
          auVar115._12_4_ =
               (fVar271 + fVar132 +
               fVar271 * fVar271 *
               (((((fVar271 * 0.00019875691 + 0.0013981999) * fVar271 + 0.008333452) * fVar271 +
                 0.041665796) * fVar271 + 0.16666666) * fVar271 + fVar91)) * auVar218._12_4_ +
               fVar132;
          auVar115._16_4_ =
               (fVar272 + fVar133 +
               fVar272 * fVar272 *
               (((((fVar272 * 0.00019875691 + 0.0013981999) * fVar272 + 0.008333452) * fVar272 +
                 0.041665796) * fVar272 + 0.16666666) * fVar272 + fVar134)) * auVar176._0_4_ +
               fVar133;
          auVar115._20_4_ =
               (fVar273 + fVar136 +
               fVar273 * fVar273 *
               (((((fVar273 * 0.00019875691 + 0.0013981999) * fVar273 + 0.008333452) * fVar273 +
                 0.041665796) * fVar273 + 0.16666666) * fVar273 + fVar135)) * auVar176._4_4_ +
               fVar136;
          auVar115._24_4_ =
               (fVar274 + fVar138 +
               fVar274 * fVar274 *
               (((((fVar274 * 0.00019875691 + 0.0013981999) * fVar274 + 0.008333452) * fVar274 +
                 0.041665796) * fVar274 + 0.16666666) * fVar274 + fVar137)) * auVar176._8_4_ +
               fVar138;
          auVar115._28_4_ = auVar238._28_4_ + -0.6931472 + fVar267 + -0.6931472 + fVar267;
          auVar113 = vdivps_avx(auVar81,auVar115);
          break;
        case 5:
          auVar248._8_4_ = 0x42b0c0a5;
          auVar248._0_8_ = 0x42b0c0a542b0c0a5;
          auVar248._12_4_ = 0x42b0c0a5;
          auVar248._16_4_ = 0x42b0c0a5;
          auVar248._20_4_ = 0x42b0c0a5;
          auVar248._24_4_ = 0x42b0c0a5;
          auVar248._28_4_ = 0x42b0c0a5;
          auVar233 = vminps_avx(auVar248,auVar113);
          auVar254._8_4_ = 0xc2b0c0a5;
          auVar254._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar254._12_4_ = 0xc2b0c0a5;
          auVar254._16_4_ = 0xc2b0c0a5;
          auVar254._20_4_ = 0xc2b0c0a5;
          auVar254._24_4_ = 0xc2b0c0a5;
          auVar254._28_4_ = 0xc2b0c0a5;
          auVar238 = vmaxps_avx(auVar254,auVar233);
          auVar187._0_4_ = auVar238._0_4_ * 1.442695 + fVar262;
          auVar187._4_4_ = auVar238._4_4_ * 1.442695 + fVar264;
          auVar187._8_4_ = auVar238._8_4_ * 1.442695 + fVar266;
          auVar187._12_4_ = auVar238._12_4_ * 1.442695 + fVar91;
          auVar187._16_4_ = auVar238._16_4_ * 1.442695 + fVar134;
          auVar187._20_4_ = auVar238._20_4_ * 1.442695 + fVar135;
          auVar187._24_4_ = auVar238._24_4_ * 1.442695 + fVar137;
          auVar187._28_4_ = fVar204 + fVar270;
          auVar162 = vroundps_avx(auVar187,1);
          auVar233 = vcmpps_avx(auVar187,auVar162,1);
          auVar233 = vandps_avx(auVar233,auVar81);
          auVar233 = vsubps_avx(auVar162,auVar233);
          auVar27._4_4_ = auVar233._4_4_ * 0.6931472;
          auVar27._0_4_ = auVar233._0_4_ * 0.6931472;
          auVar27._8_4_ = auVar233._8_4_ * 0.6931472;
          auVar27._12_4_ = auVar233._12_4_ * 0.6931472;
          auVar27._16_4_ = auVar233._16_4_ * 0.6931472;
          auVar27._20_4_ = auVar233._20_4_ * 0.6931472;
          auVar27._24_4_ = auVar233._24_4_ * 0.6931472;
          auVar27._28_4_ = auVar162._28_4_;
          auVar238 = vsubps_avx(auVar238,auVar27);
          fVar271 = auVar238._0_4_;
          fVar272 = auVar238._4_4_;
          fVar273 = auVar238._8_4_;
          fVar274 = auVar238._12_4_;
          fVar275 = auVar238._16_4_;
          fVar276 = auVar238._20_4_;
          fVar139 = auVar238._24_4_;
          auVar175._0_4_ = (int)auVar233._0_4_;
          auVar175._4_4_ = (int)auVar233._4_4_;
          auVar175._8_4_ = (int)auVar233._8_4_;
          auVar175._12_4_ = (int)auVar233._12_4_;
          auVar188._16_4_ = (int)auVar233._16_4_;
          auVar188._0_16_ = auVar175;
          auVar188._20_4_ = (int)auVar233._20_4_;
          auVar188._24_4_ = (int)auVar233._24_4_;
          auVar188._28_4_ = (int)auVar233._28_4_;
          auVar218 = vpslld_avx(auVar175,0x17);
          auVar176 = vpslld_avx(auVar188._16_16_,0x17);
          auVar205._8_4_ = 0x3f800000;
          auVar205._0_8_ = 0x3f8000003f800000;
          auVar205._12_4_ = 0x3f800000;
          auVar176 = vpaddd_avx(auVar176,auVar205);
          auVar218 = vpaddd_avx(auVar218,auVar205);
          auVar155._0_4_ =
               (fVar271 + fVar261 +
               (((((fVar271 * 0.00019875691 + 0.0013981999) * fVar271 + 0.008333452) * fVar271 +
                 0.041665796) * fVar271 + 0.16666666) * fVar271 + fVar262) * fVar271 * fVar271) *
               auVar218._0_4_ + fVar261;
          auVar155._4_4_ =
               (fVar272 + fVar263 +
               (((((fVar272 * 0.00019875691 + 0.0013981999) * fVar272 + 0.008333452) * fVar272 +
                 0.041665796) * fVar272 + 0.16666666) * fVar272 + fVar264) * fVar272 * fVar272) *
               auVar218._4_4_ + fVar263;
          auVar155._8_4_ =
               (fVar273 + fVar265 +
               (((((fVar273 * 0.00019875691 + 0.0013981999) * fVar273 + 0.008333452) * fVar273 +
                 0.041665796) * fVar273 + 0.16666666) * fVar273 + fVar266) * fVar273 * fVar273) *
               auVar218._8_4_ + fVar265;
          auVar155._12_4_ =
               (fVar274 + fVar132 +
               (((((fVar274 * 0.00019875691 + 0.0013981999) * fVar274 + 0.008333452) * fVar274 +
                 0.041665796) * fVar274 + 0.16666666) * fVar274 + fVar91) * fVar274 * fVar274) *
               auVar218._12_4_ + fVar132;
          auVar155._16_4_ =
               (fVar275 + fVar133 +
               (((((fVar275 * 0.00019875691 + 0.0013981999) * fVar275 + 0.008333452) * fVar275 +
                 0.041665796) * fVar275 + 0.16666666) * fVar275 + fVar134) * fVar275 * fVar275) *
               auVar176._0_4_ + fVar133;
          auVar155._20_4_ =
               (fVar276 + fVar136 +
               (((((fVar276 * 0.00019875691 + 0.0013981999) * fVar276 + 0.008333452) * fVar276 +
                 0.041665796) * fVar276 + 0.16666666) * fVar276 + fVar135) * fVar276 * fVar276) *
               auVar176._4_4_ + fVar136;
          auVar155._24_4_ =
               (fVar139 + fVar138 +
               (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                 0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar137) * fVar139 * fVar139) *
               auVar176._8_4_ + fVar138;
          auVar155._28_4_ = auVar238._28_4_ + fVar267 + auVar162._28_4_ + fVar267;
          auVar189._8_4_ = 0x800000;
          auVar189._0_8_ = 0x80000000800000;
          auVar189._12_4_ = 0x800000;
          auVar189._16_4_ = 0x800000;
          auVar189._20_4_ = 0x800000;
          auVar189._24_4_ = 0x800000;
          auVar189._28_4_ = 0x800000;
          auVar162 = vmaxps_avx(auVar155,auVar189);
          auVar176 = vpsrld_avx(auVar162._16_16_,0x17);
          auVar190._8_4_ = 0x807fffff;
          auVar190._0_8_ = 0x807fffff807fffff;
          auVar190._12_4_ = 0x807fffff;
          auVar190._16_4_ = 0x807fffff;
          auVar190._20_4_ = 0x807fffff;
          auVar190._24_4_ = 0x807fffff;
          auVar190._28_4_ = 0x807fffff;
          auVar233 = vandps_avx(auVar162,auVar190);
          auVar27 = vorps_avx(auVar233,auVar217._0_32_);
          auVar215._8_4_ = 0x3f3504f3;
          auVar215._0_8_ = 0x3f3504f33f3504f3;
          auVar215._12_4_ = 0x3f3504f3;
          auVar215._16_4_ = 0x3f3504f3;
          auVar215._20_4_ = 0x3f3504f3;
          auVar215._24_4_ = 0x3f3504f3;
          auVar215._28_4_ = 0x3f3504f3;
          auVar238 = vcmpps_avx(auVar215,auVar27,2);
          auVar233 = vandnps_avx(auVar238,auVar27);
          fVar271 = auVar233._0_4_ + auVar27._0_4_ + -1.0;
          fVar272 = auVar233._4_4_ + auVar27._4_4_ + -1.0;
          fVar273 = auVar233._8_4_ + auVar27._8_4_ + -1.0;
          fVar274 = auVar233._12_4_ + auVar27._12_4_ + -1.0;
          fVar275 = auVar233._16_4_ + auVar27._16_4_ + -1.0;
          fVar276 = auVar233._20_4_ + auVar27._20_4_ + -1.0;
          fVar139 = auVar233._24_4_ + auVar27._24_4_ + -1.0;
          auVar176 = vpsubd_avx(auVar176,auVar238._16_16_);
          auVar218 = vpsrld_avx(auVar162._0_16_,0x17);
          auVar211._8_4_ = 0xffffff81;
          auVar211._0_8_ = 0xffffff81ffffff81;
          auVar211._12_4_ = 0xffffff81;
          auVar176 = vpaddd_avx(auVar176,auVar211);
          auVar218 = vpsubd_avx(auVar218,auVar238._0_16_);
          auVar218 = vpaddd_avx(auVar218,auVar211);
          auVar223._16_16_ = auVar176;
          auVar223._0_16_ = auVar218;
          auVar238 = vcmpps_avx(auVar155,_DAT_005f3660,2);
          auVar162 = vcvtdq2ps_avx(auVar223);
          auVar29._4_4_ =
               (fVar272 * fVar272 *
                (((((((((fVar272 * 0.070376836 + -0.1151461) * fVar272 + 0.116769984) * fVar272 +
                      -0.12420141) * fVar272 + 0.14249323) * fVar272 + -0.16668057) * fVar272 +
                   0.20000714) * fVar272 + -0.24999994) * fVar272 + 0.3333333) * fVar272 + -0.5) +
               auVar162._4_4_ * 0.6931472 + fVar272) * -2.0;
          auVar29._0_4_ =
               (fVar271 * fVar271 *
                (((((((((fVar271 * 0.070376836 + -0.1151461) * fVar271 + 0.116769984) * fVar271 +
                      -0.12420141) * fVar271 + 0.14249323) * fVar271 + -0.16668057) * fVar271 +
                   0.20000714) * fVar271 + -0.24999994) * fVar271 + 0.3333333) * fVar271 + -0.5) +
               auVar162._0_4_ * 0.6931472 + fVar271) * -2.0;
          auVar29._8_4_ =
               (fVar273 * fVar273 *
                (((((((((fVar273 * 0.070376836 + -0.1151461) * fVar273 + 0.116769984) * fVar273 +
                      -0.12420141) * fVar273 + 0.14249323) * fVar273 + -0.16668057) * fVar273 +
                   0.20000714) * fVar273 + -0.24999994) * fVar273 + 0.3333333) * fVar273 + -0.5) +
               auVar162._8_4_ * 0.6931472 + fVar273) * -2.0;
          auVar29._12_4_ =
               (fVar274 * fVar274 *
                (((((((((fVar274 * 0.070376836 + -0.1151461) * fVar274 + 0.116769984) * fVar274 +
                      -0.12420141) * fVar274 + 0.14249323) * fVar274 + -0.16668057) * fVar274 +
                   0.20000714) * fVar274 + -0.24999994) * fVar274 + 0.3333333) * fVar274 + -0.5) +
               auVar162._12_4_ * 0.6931472 + fVar274) * -2.0;
          auVar29._16_4_ =
               (fVar275 * fVar275 *
                (((((((((fVar275 * 0.070376836 + -0.1151461) * fVar275 + 0.116769984) * fVar275 +
                      -0.12420141) * fVar275 + 0.14249323) * fVar275 + -0.16668057) * fVar275 +
                   0.20000714) * fVar275 + -0.24999994) * fVar275 + 0.3333333) * fVar275 + -0.5) +
               auVar162._16_4_ * 0.6931472 + fVar275) * -2.0;
          auVar29._20_4_ =
               (fVar276 * fVar276 *
                (((((((((fVar276 * 0.070376836 + -0.1151461) * fVar276 + 0.116769984) * fVar276 +
                      -0.12420141) * fVar276 + 0.14249323) * fVar276 + -0.16668057) * fVar276 +
                   0.20000714) * fVar276 + -0.24999994) * fVar276 + 0.3333333) * fVar276 + -0.5) +
               auVar162._20_4_ * 0.6931472 + fVar276) * -2.0;
          auVar29._24_4_ =
               (fVar139 * fVar139 *
                (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) * fVar139 +
                      -0.12420141) * fVar139 + 0.14249323) * fVar139 + -0.16668057) * fVar139 +
                   0.20000714) * fVar139 + -0.24999994) * fVar139 + 0.3333333) * fVar139 + -0.5) +
               auVar162._24_4_ * 0.6931472 + fVar139) * -2.0;
          auVar29._28_4_ = auVar162._28_4_ + auVar233._28_4_ + auVar27._28_4_ + -1.0 + 0.0;
          auVar216._8_4_ = 0x7fffffff;
          auVar216._0_8_ = 0x7fffffff7fffffff;
          auVar216._12_4_ = 0x7fffffff;
          auVar216._16_4_ = 0x7fffffff;
          auVar216._20_4_ = 0x7fffffff;
          auVar216._24_4_ = 0x7fffffff;
          auVar216._28_4_ = 0x7fffffff;
          auVar233 = vblendvps_avx(auVar29,auVar216,auVar238);
          auVar191._8_4_ = 0x42b0c0a5;
          auVar191._0_8_ = 0x42b0c0a542b0c0a5;
          auVar191._12_4_ = 0x42b0c0a5;
          auVar191._16_4_ = 0x42b0c0a5;
          auVar191._20_4_ = 0x42b0c0a5;
          auVar191._24_4_ = 0x42b0c0a5;
          auVar191._28_4_ = 0x42b0c0a5;
          auVar233 = vminps_avx(auVar233,auVar191);
          auVar192._8_4_ = 0xc2b0c0a5;
          auVar192._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar192._12_4_ = 0xc2b0c0a5;
          auVar192._16_4_ = 0xc2b0c0a5;
          auVar192._20_4_ = 0xc2b0c0a5;
          auVar192._24_4_ = 0xc2b0c0a5;
          auVar192._28_4_ = 0xc2b0c0a5;
          auVar238 = vmaxps_avx(auVar233,auVar192);
          auVar193._0_4_ = auVar238._0_4_ * 1.442695 + fVar262;
          auVar193._4_4_ = auVar238._4_4_ * 1.442695 + fVar264;
          auVar193._8_4_ = auVar238._8_4_ * 1.442695 + fVar266;
          auVar193._12_4_ = auVar238._12_4_ * 1.442695 + fVar91;
          auVar193._16_4_ = auVar238._16_4_ * 1.442695 + fVar134;
          auVar193._20_4_ = auVar238._20_4_ * 1.442695 + fVar135;
          auVar193._24_4_ = auVar238._24_4_ * 1.442695 + fVar137;
          auVar193._28_4_ = fVar270 + 1.442695;
          auVar162 = vroundps_avx(auVar193,1);
          auVar233 = vcmpps_avx(auVar193,auVar162,1);
          auVar233 = vandps_avx(auVar233,auVar81);
          auVar233 = vsubps_avx(auVar162,auVar233);
          auVar30._4_4_ = auVar233._4_4_ * 0.6931472;
          auVar30._0_4_ = auVar233._0_4_ * 0.6931472;
          auVar30._8_4_ = auVar233._8_4_ * 0.6931472;
          auVar30._12_4_ = auVar233._12_4_ * 0.6931472;
          auVar30._16_4_ = auVar233._16_4_ * 0.6931472;
          auVar30._20_4_ = auVar233._20_4_ * 0.6931472;
          auVar30._24_4_ = auVar233._24_4_ * 0.6931472;
          auVar30._28_4_ = auVar162._28_4_;
          auVar238 = vsubps_avx(auVar238,auVar30);
          fVar270 = auVar238._0_4_;
          fVar271 = auVar238._4_4_;
          fVar272 = auVar238._8_4_;
          fVar273 = auVar238._12_4_;
          fVar274 = auVar238._16_4_;
          fVar275 = auVar238._20_4_;
          fVar276 = auVar238._24_4_;
          auVar217 = ZEXT3264(auVar217._0_32_);
          auVar90 = ZEXT3264(auVar81);
          auVar177._0_4_ = (int)auVar233._0_4_;
          auVar177._4_4_ = (int)auVar233._4_4_;
          auVar177._8_4_ = (int)auVar233._8_4_;
          auVar177._12_4_ = (int)auVar233._12_4_;
          auVar194._16_4_ = (int)auVar233._16_4_;
          auVar194._0_16_ = auVar177;
          auVar194._20_4_ = (int)auVar233._20_4_;
          auVar194._24_4_ = (int)auVar233._24_4_;
          auVar194._28_4_ = (int)auVar233._28_4_;
          auVar218 = vpslld_avx(auVar177,0x17);
          auVar176 = vpslld_avx(auVar194._16_16_,0x17);
          auVar176 = vpaddd_avx(auVar176,auVar205);
          auVar218 = vpaddd_avx(auVar218,auVar205);
          auVar156._0_4_ =
               (fVar270 + fVar261 +
               (((((fVar270 * 0.00019875691 + 0.0013981999) * fVar270 + 0.008333452) * fVar270 +
                 0.041665796) * fVar270 + 0.16666666) * fVar270 + fVar262) * fVar270 * fVar270) *
               auVar218._0_4_ + fVar261;
          auVar156._4_4_ =
               (fVar271 + fVar263 +
               (((((fVar271 * 0.00019875691 + 0.0013981999) * fVar271 + 0.008333452) * fVar271 +
                 0.041665796) * fVar271 + 0.16666666) * fVar271 + fVar264) * fVar271 * fVar271) *
               auVar218._4_4_ + fVar263;
          auVar156._8_4_ =
               (fVar272 + fVar265 +
               (((((fVar272 * 0.00019875691 + 0.0013981999) * fVar272 + 0.008333452) * fVar272 +
                 0.041665796) * fVar272 + 0.16666666) * fVar272 + fVar266) * fVar272 * fVar272) *
               auVar218._8_4_ + fVar265;
          auVar156._12_4_ =
               (fVar273 + fVar132 +
               (((((fVar273 * 0.00019875691 + 0.0013981999) * fVar273 + 0.008333452) * fVar273 +
                 0.041665796) * fVar273 + 0.16666666) * fVar273 + fVar91) * fVar273 * fVar273) *
               auVar218._12_4_ + fVar132;
          auVar156._16_4_ =
               (fVar274 + fVar133 +
               (((((fVar274 * 0.00019875691 + 0.0013981999) * fVar274 + 0.008333452) * fVar274 +
                 0.041665796) * fVar274 + 0.16666666) * fVar274 + fVar134) * fVar274 * fVar274) *
               auVar176._0_4_ + fVar133;
          auVar156._20_4_ =
               (fVar275 + fVar136 +
               (((((fVar275 * 0.00019875691 + 0.0013981999) * fVar275 + 0.008333452) * fVar275 +
                 0.041665796) * fVar275 + 0.16666666) * fVar275 + fVar135) * fVar275 * fVar275) *
               auVar176._4_4_ + fVar136;
          auVar156._24_4_ =
               (fVar276 + fVar138 +
               (((((fVar276 * 0.00019875691 + 0.0013981999) * fVar276 + 0.008333452) * fVar276 +
                 0.041665796) * fVar276 + 0.16666666) * fVar276 + fVar137) * fVar276 * fVar276) *
               auVar176._8_4_ + fVar138;
          auVar156._28_4_ = auVar238._28_4_ + fVar267 + auVar162._28_4_ + fVar267;
          auVar63._8_4_ = 0x40000000;
          auVar63._0_8_ = 0x4000000040000000;
          auVar63._12_4_ = 0x40000000;
          auVar63._16_4_ = 0x40000000;
          auVar63._20_4_ = 0x40000000;
          auVar63._24_4_ = 0x40000000;
          auVar63._28_4_ = 0x40000000;
          auVar81 = vdivps_avx(auVar63,auVar156);
          auVar154._0_4_ = auVar81._0_4_ + -1.0;
          auVar154._4_4_ = auVar81._4_4_ + -1.0;
          auVar154._8_4_ = auVar81._8_4_ + -1.0;
          auVar154._12_4_ = auVar81._12_4_ + -1.0;
          auVar154._16_4_ = auVar81._16_4_ + -1.0;
          auVar154._20_4_ = auVar81._20_4_ + -1.0;
          auVar154._24_4_ = auVar81._24_4_ + -1.0;
          goto LAB_003136a5;
        case 6:
          pfVar49 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar261 = *pfVar49;
          fVar262 = pfVar49[1];
          auVar162._0_4_ = fVar261 * fVar257 + fVar262;
          auVar162._4_4_ = fVar261 * fVar260 + fVar262;
          auVar162._8_4_ = fVar261 * auVar113._8_4_ + fVar262;
          auVar162._12_4_ = fVar261 * auVar113._12_4_ + fVar262;
          auVar162._16_4_ = fVar261 * auVar113._16_4_ + fVar262;
          auVar162._20_4_ = fVar261 * auVar113._20_4_ + fVar262;
          auVar162._24_4_ = fVar261 * auVar113._24_4_ + fVar262;
          auVar162._28_4_ = fVar261 + fVar262;
          auVar233 = vmaxps_avx(auVar162,_DAT_005f3660);
          auVar81 = vminps_avx(auVar233,auVar81);
          auVar154 = auVar81._0_28_;
LAB_003136a5:
          auVar113._4_4_ = auVar154._4_4_ * fVar260;
          auVar113._0_4_ = auVar154._0_4_ * fVar257;
          auVar113._8_4_ = auVar154._8_4_ * auVar113._8_4_;
          auVar113._12_4_ = auVar154._12_4_ * auVar113._12_4_;
          auVar113._16_4_ = auVar154._16_4_ * auVar113._16_4_;
          auVar113._20_4_ = auVar154._20_4_ * auVar113._20_4_;
          auVar113._24_4_ = auVar154._24_4_ * auVar113._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar41 * 0x20) = auVar113;
        uVar41 = uVar41 + 1;
      } while (uVar41 != uVar40);
    }
    goto LAB_00315027;
  }
  auVar253 = in_ZMM12._0_16_;
  local_d8 = (ulong)(int)uVar40;
  lVar50 = (long)(int)uVar56;
  if (0 < (int)uVar40 >> 3) {
    local_90 = (ulong)(uint)((int)uVar40 >> 3);
    lVar42 = lVar50 * 0x1c;
    local_98 = lVar50 * 0x20;
    lVar54 = lVar50 * 8;
    lVar45 = lVar50 * 0x18;
    lVar44 = lVar50 * 4;
    local_b8 = lVar50 * 0xc;
    local_c0 = 0;
    auVar90 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar217 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar41 = 0;
    lVar55 = lVar50 * 0x14;
    lVar1 = lVar50 << 4;
    do {
      local_b0 = lVar1;
      local_a8 = lVar55;
      local_80 = uVar41 * 8;
      fVar261 = 0.0;
      fVar262 = 0.0;
      fVar257 = 0.0;
      fVar260 = 0.0;
      fVar263 = 0.0;
      fVar264 = 0.0;
      fVar265 = 0.0;
      fVar266 = 0.0;
      if (pvVar24 != (void *)0x0) {
        pfVar46 = (float *)((long)pvVar24 + uVar41 * 0x20);
        fVar257 = *pfVar46;
        fVar260 = pfVar46[1];
        fVar261 = pfVar46[2];
        fVar262 = pfVar46[3];
        fVar263 = pfVar46[4];
        fVar264 = pfVar46[5];
        fVar265 = pfVar46[6];
        fVar266 = pfVar46[7];
      }
      pvVar43 = (this->weight_data_tm).data;
      local_e8._0_8_ = lVar45;
      if ((int)uVar56 < 8) {
        uVar52 = 0;
        lVar55 = local_80 * lVar50 * 4;
        lVar1 = (local_80 | 1) * lVar50 * 4;
        lVar2 = (local_80 | 2) * lVar50 * 4;
        lVar3 = (local_80 | 3) * lVar50 * 4;
        lVar4 = (local_80 | 4) * lVar50 * 4;
        lVar5 = (local_80 | 5) * lVar50 * 4;
        lVar6 = (local_80 | 6) * lVar50 * 4;
        lVar7 = (local_80 | 7) * lVar50 * 4;
        in_ZMM6 = ZEXT864(0);
        auVar82 = ZEXT832(0);
        auVar116 = ZEXT832(0);
        auVar163 = SUB6432(ZEXT864(0),0);
        auVar224 = ZEXT832(0);
        auVar234 = SUB6432(ZEXT864(0),0);
        auVar239 = ZEXT832(0);
        auVar268 = SUB6432(ZEXT864(0),0);
        pfVar46 = local_138;
        local_a0 = lVar42;
      }
      else {
        auVar269 = ZEXT864(0);
        iVar35 = 7;
        lVar53 = 0;
        auVar242 = ZEXT864(0);
        auVar236 = ZEXT864(0);
        auVar228 = ZEXT864(0);
        auVar241 = ZEXT864(0);
        auVar235 = ZEXT864(0);
        auVar227 = ZEXT864(0);
        in_ZMM6 = ZEXT864(0);
        do {
          pfVar46 = (float *)((long)local_138 + lVar53);
          fVar91 = *pfVar46;
          fVar132 = pfVar46[1];
          fVar133 = pfVar46[2];
          fVar134 = pfVar46[3];
          fVar135 = pfVar46[4];
          fVar136 = pfVar46[5];
          fVar137 = pfVar46[6];
          pfVar37 = (float *)((long)pvVar43 + lVar53 + local_c0);
          auVar268._0_4_ = fVar91 * *pfVar37 + auVar269._0_4_;
          auVar268._4_4_ = fVar132 * pfVar37[1] + auVar269._4_4_;
          auVar268._8_4_ = fVar133 * pfVar37[2] + auVar269._8_4_;
          auVar268._12_4_ = fVar134 * pfVar37[3] + auVar269._12_4_;
          auVar268._16_4_ = fVar135 * pfVar37[4] + auVar269._16_4_;
          auVar268._20_4_ = fVar136 * pfVar37[5] + auVar269._20_4_;
          auVar268._24_4_ = fVar137 * pfVar37[6] + auVar269._24_4_;
          fVar138 = in_ZMM11._28_4_;
          auVar268._28_4_ = fVar138 + auVar269._28_4_;
          auVar269 = ZEXT3264(auVar268);
          pfVar37 = (float *)((long)pvVar43 + lVar53 + lVar44);
          pfVar39 = (float *)((long)pvVar43 + lVar53 + lVar54);
          auVar239._0_4_ = fVar91 * *pfVar37 + auVar242._0_4_;
          auVar239._4_4_ = fVar132 * pfVar37[1] + auVar242._4_4_;
          auVar239._8_4_ = fVar133 * pfVar37[2] + auVar242._8_4_;
          auVar239._12_4_ = fVar134 * pfVar37[3] + auVar242._12_4_;
          auVar239._16_4_ = fVar135 * pfVar37[4] + auVar242._16_4_;
          auVar239._20_4_ = fVar136 * pfVar37[5] + auVar242._20_4_;
          auVar239._24_4_ = fVar137 * pfVar37[6] + auVar242._24_4_;
          auVar239._28_4_ = fVar138 + auVar242._28_4_;
          auVar242 = ZEXT3264(auVar239);
          auVar234._0_4_ = fVar91 * *pfVar39 + auVar236._0_4_;
          auVar234._4_4_ = fVar132 * pfVar39[1] + auVar236._4_4_;
          auVar234._8_4_ = fVar133 * pfVar39[2] + auVar236._8_4_;
          auVar234._12_4_ = fVar134 * pfVar39[3] + auVar236._12_4_;
          auVar234._16_4_ = fVar135 * pfVar39[4] + auVar236._16_4_;
          auVar234._20_4_ = fVar136 * pfVar39[5] + auVar236._20_4_;
          auVar234._24_4_ = fVar137 * pfVar39[6] + auVar236._24_4_;
          fVar267 = in_ZMM12._28_4_;
          auVar234._28_4_ = fVar267 + auVar236._28_4_;
          auVar236 = ZEXT3264(auVar234);
          pfVar37 = (float *)((long)pvVar43 + lVar53 + local_b8);
          auVar224._0_4_ = fVar91 * *pfVar37 + auVar228._0_4_;
          auVar224._4_4_ = fVar132 * pfVar37[1] + auVar228._4_4_;
          auVar224._8_4_ = fVar133 * pfVar37[2] + auVar228._8_4_;
          auVar224._12_4_ = fVar134 * pfVar37[3] + auVar228._12_4_;
          auVar224._16_4_ = fVar135 * pfVar37[4] + auVar228._16_4_;
          auVar224._20_4_ = fVar136 * pfVar37[5] + auVar228._20_4_;
          auVar224._24_4_ = fVar137 * pfVar37[6] + auVar228._24_4_;
          auVar224._28_4_ = fVar138 + auVar228._28_4_;
          auVar228 = ZEXT3264(auVar224);
          pfVar37 = (float *)((long)pvVar43 + lVar53 + local_b0);
          auVar163._0_4_ = fVar91 * *pfVar37 + auVar241._0_4_;
          auVar163._4_4_ = fVar132 * pfVar37[1] + auVar241._4_4_;
          auVar163._8_4_ = fVar133 * pfVar37[2] + auVar241._8_4_;
          auVar163._12_4_ = fVar134 * pfVar37[3] + auVar241._12_4_;
          auVar163._16_4_ = fVar135 * pfVar37[4] + auVar241._16_4_;
          auVar163._20_4_ = fVar136 * pfVar37[5] + auVar241._20_4_;
          auVar163._24_4_ = fVar137 * pfVar37[6] + auVar241._24_4_;
          auVar163._28_4_ = fVar138 + auVar241._28_4_;
          auVar241 = ZEXT3264(auVar163);
          pfVar37 = (float *)((long)pvVar43 + lVar53 + local_a8);
          in_ZMM11 = ZEXT3264(CONCAT428(fVar138,CONCAT424(fVar137 * pfVar37[6],
                                                          CONCAT420(fVar136 * pfVar37[5],
                                                                    CONCAT416(fVar135 * pfVar37[4],
                                                                              CONCAT412(fVar134 * 
                                                  pfVar37[3],
                                                  CONCAT48(fVar133 * pfVar37[2],
                                                           CONCAT44(fVar132 * pfVar37[1],
                                                                    fVar91 * *pfVar37))))))));
          pfVar39 = (float *)((long)pvVar43 + lVar53 + lVar45);
          in_ZMM12 = ZEXT3264(CONCAT428(fVar267,CONCAT424(fVar137 * pfVar39[6],
                                                          CONCAT420(fVar136 * pfVar39[5],
                                                                    CONCAT416(fVar135 * pfVar39[4],
                                                                              CONCAT412(fVar134 * 
                                                  pfVar39[3],
                                                  CONCAT48(fVar133 * pfVar39[2],
                                                           CONCAT44(fVar132 * pfVar39[1],
                                                                    fVar91 * *pfVar39))))))));
          auVar116._0_4_ = fVar91 * *pfVar37 + auVar235._0_4_;
          auVar116._4_4_ = fVar132 * pfVar37[1] + auVar235._4_4_;
          auVar116._8_4_ = fVar133 * pfVar37[2] + auVar235._8_4_;
          auVar116._12_4_ = fVar134 * pfVar37[3] + auVar235._12_4_;
          auVar116._16_4_ = fVar135 * pfVar37[4] + auVar235._16_4_;
          auVar116._20_4_ = fVar136 * pfVar37[5] + auVar235._20_4_;
          auVar116._24_4_ = fVar137 * pfVar37[6] + auVar235._24_4_;
          auVar116._28_4_ = fVar138 + auVar235._28_4_;
          auVar235 = ZEXT3264(auVar116);
          auVar82._0_4_ = fVar91 * *pfVar39 + auVar227._0_4_;
          auVar82._4_4_ = fVar132 * pfVar39[1] + auVar227._4_4_;
          auVar82._8_4_ = fVar133 * pfVar39[2] + auVar227._8_4_;
          auVar82._12_4_ = fVar134 * pfVar39[3] + auVar227._12_4_;
          auVar82._16_4_ = fVar135 * pfVar39[4] + auVar227._16_4_;
          auVar82._20_4_ = fVar136 * pfVar39[5] + auVar227._20_4_;
          auVar82._24_4_ = fVar137 * pfVar39[6] + auVar227._24_4_;
          auVar82._28_4_ = fVar267 + auVar227._28_4_;
          auVar227 = ZEXT3264(auVar82);
          pfVar37 = (float *)((long)pvVar43 + lVar53 + lVar42);
          in_ZMM6 = ZEXT3264(CONCAT428(pfVar46[7] + in_ZMM6._28_4_,
                                       CONCAT424(fVar137 * pfVar37[6] + in_ZMM6._24_4_,
                                                 CONCAT420(fVar136 * pfVar37[5] + in_ZMM6._20_4_,
                                                           CONCAT416(fVar135 * pfVar37[4] +
                                                                     in_ZMM6._16_4_,
                                                                     CONCAT412(fVar134 * pfVar37[3]
                                                                               + in_ZMM6._12_4_,
                                                                               CONCAT48(fVar133 * 
                                                  pfVar37[2] + in_ZMM6._8_4_,
                                                  CONCAT44(fVar132 * pfVar37[1] + in_ZMM6._4_4_,
                                                           fVar91 * *pfVar37 + in_ZMM6._0_4_))))))))
          ;
          iVar35 = iVar35 + 8;
          lVar53 = lVar53 + 0x20;
        } while (iVar35 < (int)uVar56);
        lVar7 = lVar53 + lVar42;
        lVar6 = lVar53 + lVar45;
        lVar5 = lVar53 + local_a8;
        lVar4 = lVar53 + local_b0;
        lVar3 = lVar53 + local_b8;
        lVar2 = lVar53 + lVar54;
        lVar1 = lVar53 + lVar44;
        lVar55 = lVar53 + local_c0;
        pfVar46 = (float *)((long)local_138 + lVar53);
        uVar52 = uVar56 & 0xfffffff8;
      }
      if (uVar56 - uVar52 != 0 && (int)uVar52 <= (int)uVar56) {
        lVar53 = 0;
        do {
          auVar176 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar53 * 4 + lVar4)),
                                   ZEXT416(*(uint *)((long)pvVar43 + lVar53 * 4 + lVar5)),0x10);
          auVar176 = vinsertps_avx(auVar176,ZEXT416(*(uint *)((long)pvVar43 + lVar53 * 4 + lVar6)),
                                   0x20);
          auVar176 = vinsertps_avx(auVar176,ZEXT416(*(uint *)((long)pvVar43 + lVar53 * 4 + lVar7)),
                                   0x30);
          auVar218 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar53 * 4 + lVar55)),
                                   ZEXT416(*(uint *)((long)pvVar43 + lVar53 * 4 + lVar1)),0x10);
          auVar218 = vinsertps_avx(auVar218,ZEXT416(*(uint *)((long)pvVar43 + lVar53 * 4 + lVar2)),
                                   0x20);
          auVar218 = vinsertps_avx(auVar218,ZEXT416(*(uint *)((long)pvVar43 + lVar53 * 4 + lVar3)),
                                   0x30);
          fVar91 = pfVar46[lVar53];
          in_ZMM11 = ZEXT3264(CONCAT428(fVar91,CONCAT424(fVar91,CONCAT420(fVar91,CONCAT416(fVar91,
                                                  CONCAT412(fVar91,CONCAT48(fVar91,CONCAT44(fVar91,
                                                  fVar91))))))));
          fVar257 = auVar218._0_4_ * fVar91 + fVar257;
          fVar260 = auVar218._4_4_ * fVar91 + fVar260;
          fVar261 = auVar218._8_4_ * fVar91 + fVar261;
          fVar262 = auVar218._12_4_ * fVar91 + fVar262;
          fVar263 = auVar176._0_4_ * fVar91 + fVar263;
          fVar264 = auVar176._4_4_ * fVar91 + fVar264;
          fVar265 = auVar176._8_4_ * fVar91 + fVar265;
          fVar266 = auVar176._12_4_ + fVar266;
          lVar53 = lVar53 + 1;
        } while (uVar56 - uVar52 != (int)lVar53);
      }
      auVar81 = vhaddps_avx(auVar268,auVar239);
      auVar233 = vhaddps_avx(auVar234,auVar224);
      auVar233 = vhaddps_avx(auVar81,auVar233);
      in_ZMM7 = ZEXT3264(auVar233);
      auVar81 = vhaddps_avx(auVar163,auVar116);
      auVar238 = vhaddps_avx(auVar82,in_ZMM6._0_32_);
      auVar238 = vhaddps_avx(auVar81,auVar238);
      auVar81 = vblendps_avx(auVar233,auVar238,0xf0);
      auVar233 = vperm2f128_avx(auVar233,auVar238,0x21);
      auVar256._0_4_ = fVar257 + auVar233._0_4_ + auVar81._0_4_;
      auVar256._4_4_ = fVar260 + auVar233._4_4_ + auVar81._4_4_;
      auVar256._8_4_ = fVar261 + auVar233._8_4_ + auVar81._8_4_;
      auVar256._12_4_ = fVar262 + auVar233._12_4_ + auVar81._12_4_;
      auVar256._16_4_ = fVar263 + auVar233._16_4_ + auVar81._16_4_;
      auVar256._20_4_ = fVar264 + auVar233._20_4_ + auVar81._20_4_;
      auVar256._24_4_ = fVar265 + auVar233._24_4_ + auVar81._24_4_;
      auVar256._28_4_ = fVar266 + auVar233._28_4_ + auVar81._28_4_;
      auVar238 = auVar217._0_32_;
      auVar233 = auVar90._0_32_;
      fVar257 = auVar90._0_4_;
      fVar260 = auVar90._4_4_;
      fVar261 = auVar90._8_4_;
      fVar262 = auVar90._12_4_;
      fVar263 = auVar90._16_4_;
      fVar264 = auVar90._20_4_;
      fVar265 = auVar90._24_4_;
      fVar266 = auVar90._28_4_;
      switch(uVar38) {
      case 1:
        auVar256 = vmaxps_avx(auVar256,auVar238);
        break;
      case 2:
        auVar81 = vmaxps_avx(auVar256,auVar238);
        auVar233 = vminps_avx(auVar256,auVar238);
        fVar257 = *(this->super_InnerProduct).activation_params.data;
        auVar256._0_4_ = fVar257 * auVar233._0_4_ + auVar81._0_4_;
        auVar256._4_4_ = fVar257 * auVar233._4_4_ + auVar81._4_4_;
        auVar256._8_4_ = fVar257 * auVar233._8_4_ + auVar81._8_4_;
        auVar256._12_4_ = fVar257 * auVar233._12_4_ + auVar81._12_4_;
        auVar256._16_4_ = fVar257 * auVar233._16_4_ + auVar81._16_4_;
        auVar256._20_4_ = fVar257 * auVar233._20_4_ + auVar81._20_4_;
        auVar256._24_4_ = fVar257 * auVar233._24_4_ + auVar81._24_4_;
        auVar256._28_4_ = auVar233._28_4_ + auVar81._28_4_;
        break;
      case 3:
        puVar25 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar12 = *puVar25;
        auVar85._4_4_ = uVar12;
        auVar85._0_4_ = uVar12;
        auVar85._8_4_ = uVar12;
        auVar85._12_4_ = uVar12;
        auVar85._16_4_ = uVar12;
        auVar85._20_4_ = uVar12;
        auVar85._24_4_ = uVar12;
        auVar85._28_4_ = uVar12;
        uVar12 = puVar25[1];
        auVar125._4_4_ = uVar12;
        auVar125._0_4_ = uVar12;
        auVar125._8_4_ = uVar12;
        auVar125._12_4_ = uVar12;
        auVar125._16_4_ = uVar12;
        auVar125._20_4_ = uVar12;
        auVar125._24_4_ = uVar12;
        auVar125._28_4_ = uVar12;
        auVar81 = vmaxps_avx(auVar256,auVar85);
        auVar256 = vminps_avx(auVar81,auVar125);
        break;
      case 4:
        uVar47 = CONCAT44(auVar256._4_4_,auVar256._0_4_);
        auVar86._0_8_ = uVar47 ^ 0x8000000080000000;
        auVar86._8_4_ = -auVar256._8_4_;
        auVar86._12_4_ = -auVar256._12_4_;
        auVar86._16_4_ = -auVar256._16_4_;
        auVar86._20_4_ = -auVar256._20_4_;
        auVar86._24_4_ = -auVar256._24_4_;
        auVar86._28_4_ = -auVar256._28_4_;
        auVar126._8_4_ = 0x42b0c0a5;
        auVar126._0_8_ = 0x42b0c0a542b0c0a5;
        auVar126._12_4_ = 0x42b0c0a5;
        auVar126._16_4_ = 0x42b0c0a5;
        auVar126._20_4_ = 0x42b0c0a5;
        auVar126._24_4_ = 0x42b0c0a5;
        auVar126._28_4_ = 0x42b0c0a5;
        auVar81 = vminps_avx(auVar86,auVar126);
        auVar127._8_4_ = 0xc2b0c0a5;
        auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar127._12_4_ = 0xc2b0c0a5;
        auVar127._16_4_ = 0xc2b0c0a5;
        auVar127._20_4_ = 0xc2b0c0a5;
        auVar127._24_4_ = 0xc2b0c0a5;
        auVar127._28_4_ = 0xc2b0c0a5;
        auVar238 = vmaxps_avx(auVar81,auVar127);
        auVar128._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
        auVar128._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
        auVar128._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
        auVar128._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
        auVar128._16_4_ = auVar238._16_4_ * 1.442695 + 0.5;
        auVar128._20_4_ = auVar238._20_4_ * 1.442695 + 0.5;
        auVar128._24_4_ = auVar238._24_4_ * 1.442695 + 0.5;
        auVar128._28_4_ = 0x3ff8aa3b;
        auVar113 = vroundps_avx(auVar128,1);
        auVar81 = vcmpps_avx(auVar128,auVar113,1);
        auVar81 = vandps_avx(auVar81,auVar233);
        auVar81 = vsubps_avx(auVar113,auVar81);
        fVar91 = auVar238._0_4_ + auVar81._0_4_ * -0.6931472;
        fVar132 = auVar238._4_4_ + auVar81._4_4_ * -0.6931472;
        fVar133 = auVar238._8_4_ + auVar81._8_4_ * -0.6931472;
        fVar134 = auVar238._12_4_ + auVar81._12_4_ * -0.6931472;
        fVar135 = auVar238._16_4_ + auVar81._16_4_ * -0.6931472;
        fVar136 = auVar238._20_4_ + auVar81._20_4_ * -0.6931472;
        fVar137 = auVar238._24_4_ + auVar81._24_4_ * -0.6931472;
        in_ZMM7 = ZEXT3264(CONCAT428(0x3c088908,
                                     CONCAT424(0x3c088908,
                                               CONCAT420(0x3c088908,
                                                         CONCAT416(0x3c088908,
                                                                   CONCAT412(0x3c088908,
                                                                             CONCAT48(0x3c088908,
                                                                                                                                                                            
                                                  0x3c0889083c088908)))))));
        fVar138 = ((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                   0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5;
        fVar267 = ((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5;
        fVar270 = ((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5;
        fVar271 = ((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5;
        fVar272 = ((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5;
        fVar273 = ((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5;
        fVar274 = ((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3f37e013,
                                     CONCAT424(fVar274,CONCAT420(fVar273,CONCAT416(fVar272,CONCAT412
                                                  (fVar271,CONCAT48(fVar270,CONCAT44(fVar267,fVar138
                                                                                    ))))))));
        auVar100._0_4_ = (int)auVar81._0_4_;
        auVar100._4_4_ = (int)auVar81._4_4_;
        auVar100._8_4_ = (int)auVar81._8_4_;
        auVar100._12_4_ = (int)auVar81._12_4_;
        auVar129._16_4_ = (int)auVar81._16_4_;
        auVar129._0_16_ = auVar100;
        auVar129._20_4_ = (int)auVar81._20_4_;
        auVar129._24_4_ = (int)auVar81._24_4_;
        auVar129._28_4_ = (int)auVar81._28_4_;
        auVar218 = vpslld_avx(auVar100,0x17);
        auVar176 = vpslld_avx(auVar129._16_16_,0x17);
        auVar58._8_4_ = 0x3f800000;
        auVar58._0_8_ = 0x3f8000003f800000;
        auVar58._12_4_ = 0x3f800000;
        auVar176 = vpaddd_avx(auVar176,auVar58);
        auVar218 = vpaddd_avx(auVar218,auVar58);
        auVar87._0_4_ = (fVar91 + fVar257 + fVar91 * fVar91 * fVar138) * auVar218._0_4_ + fVar257;
        auVar87._4_4_ = (fVar132 + fVar260 + fVar132 * fVar132 * fVar267) * auVar218._4_4_ + fVar260
        ;
        auVar87._8_4_ = (fVar133 + fVar261 + fVar133 * fVar133 * fVar270) * auVar218._8_4_ + fVar261
        ;
        auVar87._12_4_ =
             (fVar134 + fVar262 + fVar134 * fVar134 * fVar271) * auVar218._12_4_ + fVar262;
        auVar87._16_4_ =
             (fVar135 + fVar263 + fVar135 * fVar135 * fVar272) * auVar176._0_4_ + fVar263;
        auVar87._20_4_ =
             (fVar136 + fVar264 + fVar136 * fVar136 * fVar273) * auVar176._4_4_ + fVar264;
        auVar87._24_4_ =
             (fVar137 + fVar265 + fVar137 * fVar137 * fVar274) * auVar176._8_4_ + fVar265;
        auVar87._28_4_ = auVar238._28_4_ + -0.6931472 + fVar266 + -0.6931472 + fVar266;
        auVar256 = vdivps_avx(auVar233,auVar87);
        break;
      case 5:
        auVar240._8_4_ = 0x42b0c0a5;
        auVar240._0_8_ = 0x42b0c0a542b0c0a5;
        auVar240._12_4_ = 0x42b0c0a5;
        auVar240._16_4_ = 0x42b0c0a5;
        auVar240._20_4_ = 0x42b0c0a5;
        auVar240._24_4_ = 0x42b0c0a5;
        auVar240._28_4_ = 0x42b0c0a5;
        auVar238 = vminps_avx(auVar256,auVar240);
        auVar245._8_4_ = 0xc2b0c0a5;
        auVar245._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar245._12_4_ = 0xc2b0c0a5;
        auVar245._16_4_ = 0xc2b0c0a5;
        auVar245._20_4_ = 0xc2b0c0a5;
        auVar245._24_4_ = 0xc2b0c0a5;
        auVar245._28_4_ = 0xc2b0c0a5;
        auVar238 = vmaxps_avx(auVar245,auVar238);
        in_ZMM11 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar196._8_4_ = 0x3f000000;
        auVar196._0_8_ = 0x3f0000003f000000;
        auVar196._12_4_ = 0x3f000000;
        auVar196._16_4_ = 0x3f000000;
        auVar196._20_4_ = 0x3f000000;
        auVar196._24_4_ = 0x3f000000;
        auVar196._28_4_ = 0x3f000000;
        auVar117._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
        auVar117._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
        auVar117._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
        auVar117._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
        auVar117._16_4_ = auVar238._16_4_ * 1.442695 + 0.5;
        auVar117._20_4_ = auVar238._20_4_ * 1.442695 + 0.5;
        auVar117._24_4_ = auVar238._24_4_ * 1.442695 + 0.5;
        auVar117._28_4_ = auVar81._28_4_ + 0.5;
        auVar113 = vroundps_avx(auVar117,1);
        auVar81 = vcmpps_avx(auVar117,auVar113,1);
        auVar81 = vandps_avx(auVar81,auVar233);
        auVar81 = vsubps_avx(auVar113,auVar81);
        auVar31._4_4_ = auVar81._4_4_ * 0.6931472;
        auVar31._0_4_ = auVar81._0_4_ * 0.6931472;
        auVar31._8_4_ = auVar81._8_4_ * 0.6931472;
        auVar31._12_4_ = auVar81._12_4_ * 0.6931472;
        auVar31._16_4_ = auVar81._16_4_ * 0.6931472;
        auVar31._20_4_ = auVar81._20_4_ * 0.6931472;
        auVar31._24_4_ = auVar81._24_4_ * 0.6931472;
        auVar31._28_4_ = auVar113._28_4_;
        auVar238 = vsubps_avx(auVar238,auVar31);
        fVar91 = auVar238._0_4_;
        fVar132 = auVar238._4_4_;
        fVar133 = auVar238._8_4_;
        fVar134 = auVar238._12_4_;
        fVar135 = auVar238._16_4_;
        fVar136 = auVar238._20_4_;
        fVar137 = auVar238._24_4_;
        in_ZMM12 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar98._0_4_ = (int)auVar81._0_4_;
        auVar98._4_4_ = (int)auVar81._4_4_;
        auVar98._8_4_ = (int)auVar81._8_4_;
        auVar98._12_4_ = (int)auVar81._12_4_;
        auVar118._16_4_ = (int)auVar81._16_4_;
        auVar118._0_16_ = auVar98;
        auVar118._20_4_ = (int)auVar81._20_4_;
        auVar118._24_4_ = (int)auVar81._24_4_;
        auVar118._28_4_ = (int)auVar81._28_4_;
        auVar218 = vpslld_avx(auVar98,0x17);
        auVar176 = vpslld_avx(auVar118._16_16_,0x17);
        auVar184._8_4_ = 0x3f800000;
        auVar184._0_8_ = 0x3f8000003f800000;
        auVar184._12_4_ = 0x3f800000;
        auVar176 = vpaddd_avx(auVar176,auVar184);
        auVar218 = vpaddd_avx(auVar218,auVar184);
        auVar83._0_4_ =
             (fVar91 + fVar257 +
             fVar91 * fVar91 *
             (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
               0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5)) * auVar218._0_4_ + fVar257;
        auVar83._4_4_ =
             (fVar132 + fVar260 +
             fVar132 * fVar132 *
             (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
               0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar218._4_4_ + fVar260;
        auVar83._8_4_ =
             (fVar133 + fVar261 +
             fVar133 * fVar133 *
             (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
               0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar218._8_4_ + fVar261;
        auVar83._12_4_ =
             (fVar134 + fVar262 +
             fVar134 * fVar134 *
             (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
               0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5)) * auVar218._12_4_ + fVar262;
        auVar83._16_4_ =
             (fVar135 + fVar263 +
             fVar135 * fVar135 *
             (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
               0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar176._0_4_ + fVar263;
        auVar83._20_4_ =
             (fVar136 + fVar264 +
             fVar136 * fVar136 *
             (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
               0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar176._4_4_ + fVar264;
        auVar83._24_4_ =
             (fVar137 + fVar265 +
             fVar137 * fVar137 *
             (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
               0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar176._8_4_ + fVar265;
        auVar83._28_4_ = auVar238._28_4_ + fVar266 + auVar113._28_4_ + fVar266;
        auVar119._8_4_ = 0x800000;
        auVar119._0_8_ = 0x80000000800000;
        auVar119._12_4_ = 0x800000;
        auVar119._16_4_ = 0x800000;
        auVar119._20_4_ = 0x800000;
        auVar119._24_4_ = 0x800000;
        auVar119._28_4_ = 0x800000;
        auVar113 = vmaxps_avx(auVar83,auVar119);
        auVar176 = vpsrld_avx(auVar113._16_16_,0x17);
        auVar120._8_4_ = 0x807fffff;
        auVar120._0_8_ = 0x807fffff807fffff;
        auVar120._12_4_ = 0x807fffff;
        auVar120._16_4_ = 0x807fffff;
        auVar120._20_4_ = 0x807fffff;
        auVar120._24_4_ = 0x807fffff;
        auVar120._28_4_ = 0x807fffff;
        auVar81 = vandps_avx(auVar113,auVar120);
        auVar162 = vorps_avx(auVar81,auVar196);
        auVar225._8_4_ = 0x3f3504f3;
        auVar225._0_8_ = 0x3f3504f33f3504f3;
        auVar225._12_4_ = 0x3f3504f3;
        auVar225._16_4_ = 0x3f3504f3;
        auVar225._20_4_ = 0x3f3504f3;
        auVar225._24_4_ = 0x3f3504f3;
        auVar225._28_4_ = 0x3f3504f3;
        auVar238 = vcmpps_avx(auVar225,auVar162,2);
        auVar81 = vandnps_avx(auVar238,auVar162);
        fVar91 = auVar81._0_4_ + auVar162._0_4_ + -1.0;
        fVar132 = auVar81._4_4_ + auVar162._4_4_ + -1.0;
        fVar133 = auVar81._8_4_ + auVar162._8_4_ + -1.0;
        fVar134 = auVar81._12_4_ + auVar162._12_4_ + -1.0;
        fVar135 = auVar81._16_4_ + auVar162._16_4_ + -1.0;
        fVar136 = auVar81._20_4_ + auVar162._20_4_ + -1.0;
        fVar137 = auVar81._24_4_ + auVar162._24_4_ + -1.0;
        auVar176 = vpsubd_avx(auVar176,auVar238._16_16_);
        auVar218 = vpsrld_avx(auVar113._0_16_,0x17);
        auVar229._8_4_ = 0xffffff81;
        auVar229._0_8_ = 0xffffff81ffffff81;
        auVar229._12_4_ = 0xffffff81;
        auVar176 = vpaddd_avx(auVar229,auVar176);
        auVar218 = vpsubd_avx(auVar218,auVar238._0_16_);
        auVar218 = vpaddd_avx(auVar229,auVar218);
        auVar164._16_16_ = auVar176;
        auVar164._0_16_ = auVar218;
        auVar238 = vcmpps_avx(auVar83,_DAT_005f3660,2);
        auVar113 = vcvtdq2ps_avx(auVar164);
        auVar32._4_4_ =
             (auVar113._4_4_ * 0.6931472 + fVar132 +
             fVar132 * fVar132 *
             (((((((((fVar132 * 0.070376836 + -0.1151461) * fVar132 + 0.116769984) * fVar132 +
                   -0.12420141) * fVar132 + 0.14249323) * fVar132 + -0.16668057) * fVar132 +
                0.20000714) * fVar132 + -0.24999994) * fVar132 + 0.3333333) * fVar132 + -0.5)) *
             -2.0;
        auVar32._0_4_ =
             (auVar113._0_4_ * 0.6931472 + fVar91 +
             fVar91 * fVar91 *
             (((((((((fVar91 * 0.070376836 + -0.1151461) * fVar91 + 0.116769984) * fVar91 +
                   -0.12420141) * fVar91 + 0.14249323) * fVar91 + -0.16668057) * fVar91 + 0.20000714
                ) * fVar91 + -0.24999994) * fVar91 + 0.3333333) * fVar91 + -0.5)) * -2.0;
        auVar32._8_4_ =
             (auVar113._8_4_ * 0.6931472 + fVar133 +
             fVar133 * fVar133 *
             (((((((((fVar133 * 0.070376836 + -0.1151461) * fVar133 + 0.116769984) * fVar133 +
                   -0.12420141) * fVar133 + 0.14249323) * fVar133 + -0.16668057) * fVar133 +
                0.20000714) * fVar133 + -0.24999994) * fVar133 + 0.3333333) * fVar133 + -0.5)) *
             -2.0;
        auVar32._12_4_ =
             (auVar113._12_4_ * 0.6931472 + fVar134 +
             fVar134 * fVar134 *
             (((((((((fVar134 * 0.070376836 + -0.1151461) * fVar134 + 0.116769984) * fVar134 +
                   -0.12420141) * fVar134 + 0.14249323) * fVar134 + -0.16668057) * fVar134 +
                0.20000714) * fVar134 + -0.24999994) * fVar134 + 0.3333333) * fVar134 + -0.5)) *
             -2.0;
        auVar32._16_4_ =
             (auVar113._16_4_ * 0.6931472 + fVar135 +
             fVar135 * fVar135 *
             (((((((((fVar135 * 0.070376836 + -0.1151461) * fVar135 + 0.116769984) * fVar135 +
                   -0.12420141) * fVar135 + 0.14249323) * fVar135 + -0.16668057) * fVar135 +
                0.20000714) * fVar135 + -0.24999994) * fVar135 + 0.3333333) * fVar135 + -0.5)) *
             -2.0;
        auVar32._20_4_ =
             (auVar113._20_4_ * 0.6931472 + fVar136 +
             fVar136 * fVar136 *
             (((((((((fVar136 * 0.070376836 + -0.1151461) * fVar136 + 0.116769984) * fVar136 +
                   -0.12420141) * fVar136 + 0.14249323) * fVar136 + -0.16668057) * fVar136 +
                0.20000714) * fVar136 + -0.24999994) * fVar136 + 0.3333333) * fVar136 + -0.5)) *
             -2.0;
        auVar32._24_4_ =
             (auVar113._24_4_ * 0.6931472 + fVar137 +
             fVar137 * fVar137 *
             (((((((((fVar137 * 0.070376836 + -0.1151461) * fVar137 + 0.116769984) * fVar137 +
                   -0.12420141) * fVar137 + 0.14249323) * fVar137 + -0.16668057) * fVar137 +
                0.20000714) * fVar137 + -0.24999994) * fVar137 + 0.3333333) * fVar137 + -0.5)) *
             -2.0;
        auVar32._28_4_ = auVar113._28_4_ + auVar81._28_4_ + auVar162._28_4_ + -1.0 + 0.0;
        auVar165._8_4_ = 0x7fffffff;
        auVar165._0_8_ = 0x7fffffff7fffffff;
        auVar165._12_4_ = 0x7fffffff;
        auVar165._16_4_ = 0x7fffffff;
        auVar165._20_4_ = 0x7fffffff;
        auVar165._24_4_ = 0x7fffffff;
        auVar165._28_4_ = 0x7fffffff;
        auVar81 = vblendvps_avx(auVar32,auVar165,auVar238);
        auVar121._8_4_ = 0x42b0c0a5;
        auVar121._0_8_ = 0x42b0c0a542b0c0a5;
        auVar121._12_4_ = 0x42b0c0a5;
        auVar121._16_4_ = 0x42b0c0a5;
        auVar121._20_4_ = 0x42b0c0a5;
        auVar121._24_4_ = 0x42b0c0a5;
        auVar121._28_4_ = 0x42b0c0a5;
        auVar81 = vminps_avx(auVar81,auVar121);
        auVar122._8_4_ = 0xc2b0c0a5;
        auVar122._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar122._12_4_ = 0xc2b0c0a5;
        auVar122._16_4_ = 0xc2b0c0a5;
        auVar122._20_4_ = 0xc2b0c0a5;
        auVar122._24_4_ = 0xc2b0c0a5;
        auVar122._28_4_ = 0xc2b0c0a5;
        auVar238 = vmaxps_avx(auVar81,auVar122);
        auVar123._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
        auVar123._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
        auVar123._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
        auVar123._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
        auVar123._16_4_ = auVar238._16_4_ * 1.442695 + 0.5;
        auVar123._20_4_ = auVar238._20_4_ * 1.442695 + 0.5;
        auVar123._24_4_ = auVar238._24_4_ * 1.442695 + 0.5;
        auVar123._28_4_ = 0xc2afc0a5;
        auVar113 = vroundps_avx(auVar123,1);
        auVar81 = vcmpps_avx(auVar123,auVar113,1);
        auVar81 = vandps_avx(auVar81,auVar233);
        auVar81 = vsubps_avx(auVar113,auVar81);
        auVar33._4_4_ = auVar81._4_4_ * 0.6931472;
        auVar33._0_4_ = auVar81._0_4_ * 0.6931472;
        auVar33._8_4_ = auVar81._8_4_ * 0.6931472;
        auVar33._12_4_ = auVar81._12_4_ * 0.6931472;
        auVar33._16_4_ = auVar81._16_4_ * 0.6931472;
        auVar33._20_4_ = auVar81._20_4_ * 0.6931472;
        auVar33._24_4_ = auVar81._24_4_ * 0.6931472;
        auVar33._28_4_ = auVar113._28_4_;
        auVar238 = vsubps_avx(auVar238,auVar33);
        fVar91 = auVar238._0_4_;
        fVar132 = auVar238._4_4_;
        fVar133 = auVar238._8_4_;
        fVar134 = auVar238._12_4_;
        fVar135 = auVar238._16_4_;
        fVar136 = auVar238._20_4_;
        fVar137 = auVar238._24_4_;
        auVar217 = ZEXT864(0) << 0x20;
        in_ZMM7 = ZEXT3264(auVar196);
        auVar90 = ZEXT3264(auVar233);
        fVar138 = ((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                   0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5;
        fVar267 = ((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5;
        fVar270 = ((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5;
        fVar271 = ((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5;
        fVar272 = ((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5;
        fVar273 = ((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5;
        fVar274 = ((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3f37d30c,
                                     CONCAT424(fVar274,CONCAT420(fVar273,CONCAT416(fVar272,CONCAT412
                                                  (fVar271,CONCAT48(fVar270,CONCAT44(fVar267,fVar138
                                                                                    ))))))));
        auVar99._0_4_ = (int)auVar81._0_4_;
        auVar99._4_4_ = (int)auVar81._4_4_;
        auVar99._8_4_ = (int)auVar81._8_4_;
        auVar99._12_4_ = (int)auVar81._12_4_;
        auVar124._16_4_ = (int)auVar81._16_4_;
        auVar124._0_16_ = auVar99;
        auVar124._20_4_ = (int)auVar81._20_4_;
        auVar124._24_4_ = (int)auVar81._24_4_;
        auVar124._28_4_ = (int)auVar81._28_4_;
        auVar218 = vpslld_avx(auVar99,0x17);
        auVar176 = vpslld_avx(auVar124._16_16_,0x17);
        auVar176 = vpaddd_avx(auVar176,auVar184);
        auVar218 = vpaddd_avx(auVar218,auVar184);
        auVar84._0_4_ = (fVar91 + fVar257 + fVar91 * fVar91 * fVar138) * auVar218._0_4_ + fVar257;
        auVar84._4_4_ = (fVar132 + fVar260 + fVar132 * fVar132 * fVar267) * auVar218._4_4_ + fVar260
        ;
        auVar84._8_4_ = (fVar133 + fVar261 + fVar133 * fVar133 * fVar270) * auVar218._8_4_ + fVar261
        ;
        auVar84._12_4_ =
             (fVar134 + fVar262 + fVar134 * fVar134 * fVar271) * auVar218._12_4_ + fVar262;
        auVar84._16_4_ =
             (fVar135 + fVar263 + fVar135 * fVar135 * fVar272) * auVar176._0_4_ + fVar263;
        auVar84._20_4_ =
             (fVar136 + fVar264 + fVar136 * fVar136 * fVar273) * auVar176._4_4_ + fVar264;
        auVar84._24_4_ =
             (fVar137 + fVar265 + fVar137 * fVar137 * fVar274) * auVar176._8_4_ + fVar265;
        auVar84._28_4_ = auVar238._28_4_ + fVar266 + auVar113._28_4_ + fVar266;
        auVar64._8_4_ = 0x40000000;
        auVar64._0_8_ = 0x4000000040000000;
        auVar64._12_4_ = 0x40000000;
        auVar64._16_4_ = 0x40000000;
        auVar64._20_4_ = 0x40000000;
        auVar64._24_4_ = 0x40000000;
        auVar64._28_4_ = 0x40000000;
        auVar81 = vdivps_avx(auVar64,auVar84);
        auVar80._0_4_ = auVar81._0_4_ + -1.0;
        auVar80._4_4_ = auVar81._4_4_ + -1.0;
        auVar80._8_4_ = auVar81._8_4_ + -1.0;
        auVar80._12_4_ = auVar81._12_4_ + -1.0;
        auVar80._16_4_ = auVar81._16_4_ + -1.0;
        auVar80._20_4_ = auVar81._20_4_ + -1.0;
        auVar80._24_4_ = auVar81._24_4_ + -1.0;
        goto LAB_00314514;
      case 6:
        pfVar46 = (float *)(this->super_InnerProduct).activation_params.data;
        fVar257 = *pfVar46;
        fVar260 = pfVar46[1];
        auVar88._0_4_ = auVar256._0_4_ * fVar257 + fVar260;
        auVar88._4_4_ = auVar256._4_4_ * fVar257 + fVar260;
        auVar88._8_4_ = auVar256._8_4_ * fVar257 + fVar260;
        auVar88._12_4_ = auVar256._12_4_ * fVar257 + fVar260;
        auVar88._16_4_ = auVar256._16_4_ * fVar257 + fVar260;
        auVar88._20_4_ = auVar256._20_4_ * fVar257 + fVar260;
        auVar88._24_4_ = auVar256._24_4_ * fVar257 + fVar260;
        auVar88._28_4_ = fVar257 + fVar260;
        auVar81 = vmaxps_avx(auVar238,auVar88);
        auVar81 = vminps_avx(auVar81,auVar233);
        auVar80 = auVar81._0_28_;
LAB_00314514:
        auVar256._4_4_ = auVar256._4_4_ * auVar80._4_4_;
        auVar256._0_4_ = auVar256._0_4_ * auVar80._0_4_;
        auVar256._8_4_ = auVar256._8_4_ * auVar80._8_4_;
        auVar256._12_4_ = auVar256._12_4_ * auVar80._12_4_;
        auVar256._16_4_ = auVar256._16_4_ * auVar80._16_4_;
        auVar256._20_4_ = auVar256._20_4_ * auVar80._20_4_;
        auVar256._24_4_ = auVar256._24_4_ * auVar80._24_4_;
      }
      auVar253 = in_ZMM12._0_16_;
      *(undefined1 (*) [32])((long)top_blob->data + uVar41 * 0x20) = auVar256;
      uVar41 = uVar41 + 1;
      lVar42 = lVar42 + local_98;
      lVar45 = lVar45 + local_98;
      local_b8 = local_b8 + local_98;
      lVar54 = lVar54 + local_98;
      lVar44 = lVar44 + local_98;
      local_c0 = local_c0 + local_98;
      lVar55 = local_a8 + local_98;
      lVar1 = local_b0 + local_98;
      local_d0 = this;
      local_c8 = top_blob;
      local_88 = (ulong)uVar38;
    } while (uVar41 != local_90);
  }
  uVar41 = local_d8 & 0xfffffffffffffff8;
  if ((uVar40 >> 2 & 1) == 0) goto LAB_00314c44;
  if (pvVar24 == (void *)0x0) {
    fVar257 = 0.0;
    fVar260 = 0.0;
    fVar261 = 0.0;
    fVar262 = 0.0;
  }
  else {
    pfVar46 = (float *)((long)pvVar24 + uVar41 * 4);
    fVar257 = *pfVar46;
    fVar260 = pfVar46[1];
    fVar261 = pfVar46[2];
    fVar262 = pfVar46[3];
  }
  pvVar26 = (this->weight_data_tm).data;
  pvVar43 = (void *)((long)pvVar26 + uVar41 * lVar50 * 4);
  if ((int)uVar56 < 8) {
    uVar52 = 0;
    lVar54 = (uVar41 | 1) * lVar50 * 4;
    lVar44 = (uVar41 | 2) * lVar50 * 4;
    lVar45 = (uVar41 | 3) * lVar50 * 4;
    auVar130 = ZEXT832(0);
    auVar197 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar166 = ZEXT832(0);
    auVar89 = ZEXT832(0);
    pfVar46 = local_138;
  }
  else {
    uVar52 = uVar56 & 0xfffffff8;
    lVar54 = (uVar41 + 3) * lVar50;
    lVar44 = (uVar41 + 2) * lVar50;
    lVar42 = (uVar41 + 1) * lVar50;
    auVar90 = ZEXT864(0);
    iVar35 = 7;
    lVar55 = 0;
    auVar227 = ZEXT864(0);
    auVar235 = ZEXT1664((undefined1  [16])0x0);
    auVar217 = ZEXT864(0);
    do {
      pfVar46 = (float *)((long)local_138 + lVar55);
      fVar263 = *pfVar46;
      fVar264 = pfVar46[1];
      fVar265 = pfVar46[2];
      fVar266 = pfVar46[3];
      fVar91 = pfVar46[4];
      fVar132 = pfVar46[5];
      fVar133 = pfVar46[6];
      pfVar37 = (float *)((long)pvVar43 + lVar55);
      auVar130._0_4_ = fVar263 * *pfVar37 + auVar217._0_4_;
      auVar130._4_4_ = fVar264 * pfVar37[1] + auVar217._4_4_;
      auVar130._8_4_ = fVar265 * pfVar37[2] + auVar217._8_4_;
      auVar130._12_4_ = fVar266 * pfVar37[3] + auVar217._12_4_;
      auVar130._16_4_ = fVar91 * pfVar37[4] + auVar217._16_4_;
      auVar130._20_4_ = fVar132 * pfVar37[5] + auVar217._20_4_;
      auVar130._24_4_ = fVar133 * pfVar37[6] + auVar217._24_4_;
      fVar134 = in_ZMM6._28_4_;
      auVar130._28_4_ = fVar134 + auVar217._28_4_;
      auVar217 = ZEXT3264(auVar130);
      pfVar37 = (float *)((long)pvVar26 + lVar55 + lVar42 * 4);
      in_ZMM6 = ZEXT3264(CONCAT428(fVar134,CONCAT424(fVar133 * pfVar37[6],
                                                     CONCAT420(fVar132 * pfVar37[5],
                                                               CONCAT416(fVar91 * pfVar37[4],
                                                                         CONCAT412(fVar266 * pfVar37
                                                  [3],CONCAT48(fVar265 * pfVar37[2],
                                                               CONCAT44(fVar264 * pfVar37[1],
                                                                        fVar263 * *pfVar37))))))));
      pfVar39 = (float *)((long)pvVar26 + lVar55 + lVar44 * 4);
      auVar241._0_4_ = fVar263 * *pfVar39;
      auVar241._4_4_ = fVar264 * pfVar39[1];
      auVar241._8_4_ = fVar265 * pfVar39[2];
      auVar241._12_4_ = fVar266 * pfVar39[3];
      auVar241._16_4_ = fVar91 * pfVar39[4];
      auVar241._20_4_ = fVar132 * pfVar39[5];
      auVar241._28_36_ = in_ZMM7._28_36_;
      auVar241._24_4_ = fVar133 * pfVar39[6];
      auVar197._0_4_ = fVar263 * *pfVar37 + auVar235._0_4_;
      auVar197._4_4_ = fVar264 * pfVar37[1] + auVar235._4_4_;
      auVar197._8_4_ = fVar265 * pfVar37[2] + auVar235._8_4_;
      auVar197._12_4_ = fVar266 * pfVar37[3] + auVar235._12_4_;
      auVar197._16_4_ = fVar91 * pfVar37[4] + auVar235._16_4_;
      auVar197._20_4_ = fVar132 * pfVar37[5] + auVar235._20_4_;
      auVar197._24_4_ = fVar133 * pfVar37[6] + auVar235._24_4_;
      auVar197._28_4_ = fVar134 + auVar235._28_4_;
      auVar235 = ZEXT3264(auVar197);
      auVar166._0_4_ = auVar241._0_4_ + auVar227._0_4_;
      auVar166._4_4_ = auVar241._4_4_ + auVar227._4_4_;
      auVar166._8_4_ = auVar241._8_4_ + auVar227._8_4_;
      auVar166._12_4_ = auVar241._12_4_ + auVar227._12_4_;
      auVar166._16_4_ = auVar241._16_4_ + auVar227._16_4_;
      auVar166._20_4_ = auVar241._20_4_ + auVar227._20_4_;
      auVar166._24_4_ = auVar241._24_4_ + auVar227._24_4_;
      auVar166._28_4_ = in_ZMM7._28_4_ + auVar227._28_4_;
      auVar227 = ZEXT3264(auVar166);
      pfVar37 = (float *)((long)pvVar26 + lVar55 + lVar54 * 4);
      auVar89._0_4_ = fVar263 * *pfVar37 + auVar90._0_4_;
      auVar89._4_4_ = fVar264 * pfVar37[1] + auVar90._4_4_;
      auVar89._8_4_ = fVar265 * pfVar37[2] + auVar90._8_4_;
      auVar89._12_4_ = fVar266 * pfVar37[3] + auVar90._12_4_;
      auVar89._16_4_ = fVar91 * pfVar37[4] + auVar90._16_4_;
      auVar89._20_4_ = fVar132 * pfVar37[5] + auVar90._20_4_;
      auVar89._24_4_ = fVar133 * pfVar37[6] + auVar90._24_4_;
      auVar89._28_4_ = pfVar46[7] + auVar90._28_4_;
      auVar90 = ZEXT3264(auVar89);
      iVar35 = iVar35 + 8;
      lVar55 = lVar55 + 0x20;
      in_ZMM7 = ZEXT3264(auVar241._0_32_);
    } while (iVar35 < (int)uVar56);
    lVar45 = lVar55 + lVar54 * 4;
    lVar44 = lVar55 + lVar44 * 4;
    lVar54 = lVar55 + lVar42 * 4;
    pvVar43 = (void *)((long)pvVar43 + lVar55);
    pfVar46 = (float *)((long)local_138 + lVar55);
  }
  lVar54 = (long)pvVar26 + lVar54;
  lVar44 = (long)pvVar26 + lVar44;
  lVar45 = (long)pvVar26 + lVar45;
  auVar212 = ZEXT816(0) << 0x40;
  if ((int)(uVar52 | 3) < (int)uVar56) {
    lVar42 = 0;
    auVar90 = ZEXT864(0);
    uVar51 = uVar52;
    auVar176 = ZEXT816(0);
    auVar218 = auVar212;
    auVar251 = ZEXT816(0);
    do {
      pfVar37 = (float *)((long)pfVar46 + lVar42);
      fVar263 = *pfVar37;
      fVar264 = pfVar37[1];
      fVar265 = pfVar37[2];
      fVar266 = pfVar37[3];
      pfVar37 = (float *)((long)pvVar43 + lVar42);
      auVar212._0_4_ = fVar263 * *pfVar37 + auVar218._0_4_;
      auVar212._4_4_ = fVar264 * pfVar37[1] + auVar218._4_4_;
      auVar212._8_4_ = fVar265 * pfVar37[2] + auVar218._8_4_;
      auVar212._12_4_ = fVar266 * pfVar37[3] + auVar218._12_4_;
      pfVar37 = (float *)(lVar54 + lVar42);
      auVar230._0_4_ = fVar263 * *pfVar37 + auVar90._0_4_;
      auVar230._4_4_ = fVar264 * pfVar37[1] + auVar90._4_4_;
      auVar230._8_4_ = fVar265 * pfVar37[2] + auVar90._8_4_;
      auVar230._12_4_ = fVar266 * pfVar37[3] + auVar90._12_4_;
      auVar90 = ZEXT1664(auVar230);
      pfVar37 = (float *)(lVar44 + lVar42);
      auVar222._0_4_ = fVar263 * *pfVar37 + auVar251._0_4_;
      auVar222._4_4_ = fVar264 * pfVar37[1] + auVar251._4_4_;
      auVar222._8_4_ = fVar265 * pfVar37[2] + auVar251._8_4_;
      auVar222._12_4_ = fVar266 * pfVar37[3] + auVar251._12_4_;
      pfVar37 = (float *)(lVar45 + lVar42);
      auVar206._0_4_ = fVar263 * *pfVar37 + auVar176._0_4_;
      auVar206._4_4_ = fVar264 * pfVar37[1] + auVar176._4_4_;
      auVar206._8_4_ = fVar265 * pfVar37[2] + auVar176._8_4_;
      auVar206._12_4_ = fVar266 * pfVar37[3] + auVar176._12_4_;
      uVar52 = uVar51 + 4;
      iVar35 = uVar51 + 7;
      lVar42 = lVar42 + 0x10;
      uVar51 = uVar52;
      auVar176 = auVar206;
      auVar218 = auVar212;
      auVar251 = auVar222;
    } while (iVar35 < (int)uVar56);
    pfVar46 = (float *)((long)pfVar46 + lVar42);
    lVar45 = lVar45 + lVar42;
    lVar44 = lVar44 + lVar42;
    lVar54 = lVar54 + lVar42;
    pvVar43 = (void *)((long)pvVar43 + lVar42);
  }
  else {
    auVar230 = SUB6416(ZEXT864(0),0);
    auVar222 = ZEXT816(0);
    auVar206 = ZEXT816(0);
  }
  if (uVar56 - uVar52 != 0 && (int)uVar52 <= (int)uVar56) {
    lVar42 = 0;
    do {
      auVar176 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar42 * 4)),
                               ZEXT416(*(uint *)(lVar54 + lVar42 * 4)),0x10);
      auVar176 = vinsertps_avx(auVar176,ZEXT416(*(uint *)(lVar44 + lVar42 * 4)),0x20);
      auVar176 = vinsertps_avx(auVar176,ZEXT416(*(uint *)(lVar45 + lVar42 * 4)),0x30);
      fVar263 = pfVar46[lVar42];
      fVar257 = auVar176._0_4_ * fVar263 + fVar257;
      fVar260 = auVar176._4_4_ * fVar263 + fVar260;
      fVar261 = auVar176._8_4_ * fVar263 + fVar261;
      fVar262 = auVar176._12_4_ * fVar263 + fVar262;
      lVar42 = lVar42 + 1;
    } while (uVar56 - uVar52 != (int)lVar42);
  }
  auVar81 = vhaddps_avx(auVar130,auVar197);
  auVar233 = vhaddps_avx(auVar166,auVar89);
  auVar81 = vhaddps_avx(auVar81,auVar233);
  auVar218 = vunpcklps_avx(auVar212,auVar230);
  auVar251 = vunpcklps_avx(auVar222,auVar206);
  auVar180 = vunpckhps_avx(auVar212,auVar230);
  auVar142 = vunpckhps_avx(auVar222,auVar206);
  auVar176 = vmovlhps_avx(auVar218,auVar251);
  auVar251 = vunpckhpd_avx(auVar218,auVar251);
  auVar218 = vmovlhps_avx(auVar180,auVar142);
  auVar180 = vunpckhpd_avx(auVar180,auVar142);
  auVar59._0_4_ =
       auVar251._0_4_ + auVar176._0_4_ + auVar218._0_4_ + auVar180._0_4_ + auVar81._0_4_ +
       auVar81._16_4_ + fVar257;
  auVar59._4_4_ =
       auVar251._4_4_ + auVar176._4_4_ + auVar218._4_4_ + auVar180._4_4_ + auVar81._4_4_ +
       auVar81._20_4_ + fVar260;
  auVar59._8_4_ =
       auVar251._8_4_ + auVar176._8_4_ + auVar218._8_4_ + auVar180._8_4_ + auVar81._8_4_ +
       auVar81._24_4_ + fVar261;
  auVar59._12_4_ =
       auVar251._12_4_ + auVar176._12_4_ + auVar218._12_4_ + auVar180._12_4_ + auVar81._12_4_ +
       auVar81._28_4_ + fVar262;
  switch(uVar38) {
  case 1:
    auVar34._12_4_ = 0;
    auVar34._0_12_ = ZEXT412(0);
    auVar59 = vmaxps_avx(auVar59,auVar34 << 0x20);
    break;
  case 2:
    auVar176 = vmaxps_avx(auVar59,ZEXT416(0) << 0x20);
    auVar218 = vminps_avx(auVar59,ZEXT416(0) << 0x20);
    fVar257 = *(this->super_InnerProduct).activation_params.data;
    auVar59._0_4_ = fVar257 * auVar218._0_4_ + auVar176._0_4_;
    auVar59._4_4_ = fVar257 * auVar218._4_4_ + auVar176._4_4_;
    auVar59._8_4_ = fVar257 * auVar218._8_4_ + auVar176._8_4_;
    auVar59._12_4_ = fVar257 * auVar218._12_4_ + auVar176._12_4_;
    break;
  case 3:
    puVar25 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
    uVar12 = *puVar25;
    auVar73._4_4_ = uVar12;
    auVar73._0_4_ = uVar12;
    auVar73._8_4_ = uVar12;
    auVar73._12_4_ = uVar12;
    uVar12 = puVar25[1];
    auVar108._4_4_ = uVar12;
    auVar108._0_4_ = uVar12;
    auVar108._8_4_ = uVar12;
    auVar108._12_4_ = uVar12;
    auVar176 = vmaxps_avx(auVar59,auVar73);
    auVar59 = vminps_avx(auVar176,auVar108);
    break;
  case 4:
    uVar47 = CONCAT44(auVar59._4_4_,auVar59._0_4_);
    auVar60._0_8_ = uVar47 ^ 0x8000000080000000;
    auVar60._8_4_ = -auVar59._8_4_;
    auVar60._12_4_ = -auVar59._12_4_;
    auVar74._8_4_ = 0x42b0c0a5;
    auVar74._0_8_ = 0x42b0c0a542b0c0a5;
    auVar74._12_4_ = 0x42b0c0a5;
    auVar176 = vminps_avx(auVar60,auVar74);
    auVar75._8_4_ = 0xc2b0c0a5;
    auVar75._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar75._12_4_ = 0xc2b0c0a5;
    auVar251 = vmaxps_avx(auVar176,auVar75);
    auVar76._0_4_ = auVar251._0_4_ * 1.442695 + 0.5;
    auVar76._4_4_ = auVar251._4_4_ * 1.442695 + 0.5;
    auVar76._8_4_ = auVar251._8_4_ * 1.442695 + 0.5;
    auVar76._12_4_ = auVar251._12_4_ * 1.442695 + 0.5;
    auVar152._0_4_ = (int)auVar76._0_4_;
    auVar152._4_4_ = (int)auVar76._4_4_;
    auVar152._8_4_ = (int)auVar76._8_4_;
    auVar152._12_4_ = (int)auVar76._12_4_;
    auVar218 = vcvtdq2ps_avx(auVar152);
    auVar176 = vcmpps_avx(auVar76,auVar218,1);
    auVar186._8_4_ = 0x3f800000;
    auVar186._0_8_ = 0x3f8000003f800000;
    auVar186._12_4_ = 0x3f800000;
    auVar176 = vandps_avx(auVar176,auVar186);
    auVar176 = vsubps_avx(auVar218,auVar176);
    fVar257 = auVar251._0_4_ + auVar176._0_4_ * -0.6931472;
    fVar260 = auVar251._4_4_ + auVar176._4_4_ * -0.6931472;
    fVar261 = auVar251._8_4_ + auVar176._8_4_ * -0.6931472;
    fVar262 = auVar251._12_4_ + auVar176._12_4_ * -0.6931472;
    auVar77._0_4_ = (int)auVar176._0_4_;
    auVar77._4_4_ = (int)auVar176._4_4_;
    auVar77._8_4_ = (int)auVar176._8_4_;
    auVar77._12_4_ = (int)auVar176._12_4_;
    auVar176 = vpslld_avx(auVar77,0x17);
    auVar176 = vpaddd_avx(auVar176,auVar186);
    auVar61._0_4_ =
         (fVar257 + 1.0 +
         fVar257 * fVar257 *
         (((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257 +
           0.041665796) * fVar257 + 0.16666666) * fVar257 + 0.5)) * auVar176._0_4_ + 1.0;
    auVar61._4_4_ =
         (fVar260 + 1.0 +
         fVar260 * fVar260 *
         (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
           0.041665796) * fVar260 + 0.16666666) * fVar260 + 0.5)) * auVar176._4_4_ + 1.0;
    auVar61._8_4_ =
         (fVar261 + 1.0 +
         fVar261 * fVar261 *
         (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
           0.041665796) * fVar261 + 0.16666666) * fVar261 + 0.5)) * auVar176._8_4_ + 1.0;
    auVar61._12_4_ =
         (fVar262 + 1.0 +
         fVar262 * fVar262 *
         (((((fVar262 * 0.00019875691 + 0.0013981999) * fVar262 + 0.008333452) * fVar262 +
           0.041665796) * fVar262 + 0.16666666) * fVar262 + 0.5)) * auVar176._12_4_ + 1.0;
    auVar59 = vdivps_avx(auVar186,auVar61);
    break;
  case 5:
    auVar67._8_4_ = 0x42b0c0a5;
    auVar67._0_8_ = 0x42b0c0a542b0c0a5;
    auVar67._12_4_ = 0x42b0c0a5;
    auVar176 = vminps_avx(auVar59,auVar67);
    auVar101._8_4_ = 0xc2b0c0a5;
    auVar101._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar101._12_4_ = 0xc2b0c0a5;
    auVar251 = vmaxps_avx(auVar176,auVar101);
    auVar185._8_4_ = 0x3f000000;
    auVar185._0_8_ = 0x3f0000003f000000;
    auVar185._12_4_ = 0x3f000000;
    auVar68._0_4_ = auVar251._0_4_ * 1.442695 + 0.5;
    auVar68._4_4_ = auVar251._4_4_ * 1.442695 + 0.5;
    auVar68._8_4_ = auVar251._8_4_ * 1.442695 + 0.5;
    auVar68._12_4_ = auVar251._12_4_ * 1.442695 + 0.5;
    auVar213._0_4_ = (int)auVar68._0_4_;
    auVar213._4_4_ = (int)auVar68._4_4_;
    auVar213._8_4_ = (int)auVar68._8_4_;
    auVar213._12_4_ = (int)auVar68._12_4_;
    auVar218 = vcvtdq2ps_avx(auVar213);
    auVar176 = vcmpps_avx(auVar68,auVar218,1);
    auVar151._8_4_ = 0x3f800000;
    auVar151._0_8_ = 0x3f8000003f800000;
    auVar151._12_4_ = 0x3f800000;
    auVar176 = vandps_avx(auVar176,auVar151);
    auVar176 = vsubps_avx(auVar218,auVar176);
    auVar231._0_4_ = auVar176._0_4_ * 0.6931472;
    auVar231._4_4_ = auVar176._4_4_ * 0.6931472;
    auVar231._8_4_ = auVar176._8_4_ * 0.6931472;
    auVar231._12_4_ = auVar176._12_4_ * 0.6931472;
    auVar218 = vsubps_avx(auVar251,auVar231);
    fVar257 = auVar218._0_4_;
    fVar260 = auVar218._4_4_;
    fVar261 = auVar218._8_4_;
    fVar262 = auVar218._12_4_;
    auVar255._0_4_ = (int)auVar176._0_4_;
    auVar255._4_4_ = (int)auVar176._4_4_;
    auVar255._8_4_ = (int)auVar176._8_4_;
    auVar255._12_4_ = (int)auVar176._12_4_;
    auVar176 = vpslld_avx(auVar255,0x17);
    auVar176 = vpaddd_avx(auVar176,auVar151);
    auVar69._0_4_ =
         auVar176._0_4_ *
         (fVar257 + 1.0 +
         fVar257 * fVar257 *
         (fVar257 * ((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257 +
                     0.041665796) * fVar257 + 0.16666666) + 0.5)) + 1.0;
    auVar69._4_4_ =
         auVar176._4_4_ *
         (fVar260 + 1.0 +
         fVar260 * fVar260 *
         (fVar260 * ((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                     0.041665796) * fVar260 + 0.16666666) + 0.5)) + 1.0;
    auVar69._8_4_ =
         auVar176._8_4_ *
         (fVar261 + 1.0 +
         fVar261 * fVar261 *
         (fVar261 * ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                     0.041665796) * fVar261 + 0.16666666) + 0.5)) + 1.0;
    auVar69._12_4_ =
         auVar176._12_4_ *
         (fVar262 + 1.0 +
         fVar262 * fVar262 *
         (fVar262 * ((((fVar262 * 0.00019875691 + 0.0013981999) * fVar262 + 0.008333452) * fVar262 +
                     0.041665796) * fVar262 + 0.16666666) + 0.5)) + 1.0;
    auVar218 = vcmpps_avx(auVar69,ZEXT816(0) << 0x40,2);
    auVar250._8_4_ = 0x800000;
    auVar250._0_8_ = 0x80000000800000;
    auVar250._12_4_ = 0x800000;
    auVar176 = vmaxps_avx(auVar250,auVar69);
    auVar251 = vpsrld_avx(auVar176,0x17);
    auVar258._8_4_ = 0x807fffff;
    auVar258._0_8_ = 0x807fffff807fffff;
    auVar258._12_4_ = 0x807fffff;
    auVar176 = vandps_avx(auVar258,auVar176);
    auVar180 = vorps_avx(auVar176,auVar185);
    auVar259._8_4_ = 0xffffff82;
    auVar259._0_8_ = 0xffffff82ffffff82;
    auVar259._12_4_ = 0xffffff82;
    auVar142 = vpaddd_avx(auVar251,auVar259);
    auVar252._8_4_ = 0x3f3504f3;
    auVar252._0_8_ = 0x3f3504f33f3504f3;
    auVar252._12_4_ = 0x3f3504f3;
    auVar251 = vcmpps_avx(auVar180,auVar252,1);
    auVar176 = vandps_avx(auVar251,auVar180);
    auVar253._8_4_ = 0xbf800000;
    auVar253._0_8_ = 0xbf800000bf800000;
    auVar253._12_4_ = 0xbf800000;
    fVar257 = auVar176._0_4_ + auVar180._0_4_ + -1.0;
    fVar260 = auVar176._4_4_ + auVar180._4_4_ + -1.0;
    fVar261 = auVar176._8_4_ + auVar180._8_4_ + -1.0;
    fVar262 = auVar176._12_4_ + auVar180._12_4_ + -1.0;
    auVar180 = vcvtdq2ps_avx(auVar142);
    auVar176 = vandps_avx(auVar251,auVar151);
    auVar176 = vsubps_avx(auVar180,auVar176);
    auVar70._0_4_ =
         (fVar257 + auVar176._0_4_ * 0.6931472 +
         fVar257 * fVar257 *
         (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (
                                                  fVar257 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar70._4_4_ =
         (fVar260 + auVar176._4_4_ * 0.6931472 +
         fVar260 * fVar260 *
         (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (
                                                  fVar260 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar70._8_4_ =
         (fVar261 + auVar176._8_4_ * 0.6931472 +
         fVar261 * fVar261 *
         (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (
                                                  fVar261 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar70._12_4_ =
         (fVar262 + auVar176._12_4_ * 0.6931472 +
         fVar262 * fVar262 *
         (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (
                                                  fVar262 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar102._8_4_ = 0x7fffffff;
    auVar102._0_8_ = 0x7fffffff7fffffff;
    auVar102._12_4_ = 0x7fffffff;
    auVar176 = vblendvps_avx(auVar70,auVar102,auVar218);
    auVar103._8_4_ = 0x42b0c0a5;
    auVar103._0_8_ = 0x42b0c0a542b0c0a5;
    auVar103._12_4_ = 0x42b0c0a5;
    auVar176 = vminps_avx(auVar176,auVar103);
    auVar104._8_4_ = 0xc2b0c0a5;
    auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar104._12_4_ = 0xc2b0c0a5;
    auVar251 = vmaxps_avx(auVar176,auVar104);
    auVar105._0_4_ = auVar251._0_4_ * 1.442695 + 0.5;
    auVar105._4_4_ = auVar251._4_4_ * 1.442695 + 0.5;
    auVar105._8_4_ = auVar251._8_4_ * 1.442695 + 0.5;
    auVar105._12_4_ = auVar251._12_4_ * 1.442695 + 0.5;
    auVar207._0_4_ = (int)auVar105._0_4_;
    auVar207._4_4_ = (int)auVar105._4_4_;
    auVar207._8_4_ = (int)auVar105._8_4_;
    auVar207._12_4_ = (int)auVar105._12_4_;
    auVar218 = vcvtdq2ps_avx(auVar207);
    auVar176 = vcmpps_avx(auVar105,auVar218,1);
    auVar176 = vandps_avx(auVar176,auVar151);
    auVar176 = vsubps_avx(auVar218,auVar176);
    auVar208._0_4_ = auVar176._0_4_ * 0.6931472;
    auVar208._4_4_ = auVar176._4_4_ * 0.6931472;
    auVar208._8_4_ = auVar176._8_4_ * 0.6931472;
    auVar208._12_4_ = auVar176._12_4_ * 0.6931472;
    auVar218 = vsubps_avx(auVar251,auVar208);
    fVar257 = auVar218._0_4_;
    fVar260 = auVar218._4_4_;
    fVar261 = auVar218._8_4_;
    fVar262 = auVar218._12_4_;
    auVar106._0_4_ = (int)auVar176._0_4_;
    auVar106._4_4_ = (int)auVar176._4_4_;
    auVar106._8_4_ = (int)auVar176._8_4_;
    auVar106._12_4_ = (int)auVar176._12_4_;
    auVar176 = vpslld_avx(auVar106,0x17);
    auVar176 = vpaddd_avx(auVar176,auVar151);
    auVar71._0_4_ =
         (fVar257 + 1.0 +
         fVar257 * fVar257 *
         (((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257 +
           0.041665796) * fVar257 + 0.16666666) * fVar257 + 0.5)) * auVar176._0_4_ + 1.0;
    auVar71._4_4_ =
         (fVar260 + 1.0 +
         fVar260 * fVar260 *
         (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
           0.041665796) * fVar260 + 0.16666666) * fVar260 + 0.5)) * auVar176._4_4_ + 1.0;
    auVar71._8_4_ =
         (fVar261 + 1.0 +
         fVar261 * fVar261 *
         (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
           0.041665796) * fVar261 + 0.16666666) * fVar261 + 0.5)) * auVar176._8_4_ + 1.0;
    auVar71._12_4_ =
         (fVar262 + 1.0 +
         fVar262 * fVar262 *
         (((((fVar262 * 0.00019875691 + 0.0013981999) * fVar262 + 0.008333452) * fVar262 +
           0.041665796) * fVar262 + 0.16666666) * fVar262 + 0.5)) * auVar176._12_4_ + 1.0;
    auVar107._8_4_ = 0x40000000;
    auVar107._0_8_ = 0x4000000040000000;
    auVar107._12_4_ = 0x40000000;
    auVar176 = vdivps_avx(auVar107,auVar71);
    auVar72._0_4_ = auVar176._0_4_ + -1.0;
    auVar72._4_4_ = auVar176._4_4_ + -1.0;
    auVar72._8_4_ = auVar176._8_4_ + -1.0;
    auVar72._12_4_ = auVar176._12_4_ + -1.0;
    goto LAB_00314c2b;
  case 6:
    pfVar46 = (float *)(this->super_InnerProduct).activation_params.data;
    fVar257 = *pfVar46;
    fVar260 = pfVar46[1];
    auVar78._0_4_ = fVar257 * auVar59._0_4_ + fVar260;
    auVar78._4_4_ = fVar257 * auVar59._4_4_ + fVar260;
    auVar78._8_4_ = fVar257 * auVar59._8_4_ + fVar260;
    auVar78._12_4_ = fVar257 * auVar59._12_4_ + fVar260;
    auVar176 = vmaxps_avx(auVar78,ZEXT416(0) << 0x20);
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = 0x3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar72 = vminps_avx(auVar176,auVar109);
LAB_00314c2b:
    auVar59._0_4_ = auVar72._0_4_ * auVar59._0_4_;
    auVar59._4_4_ = auVar72._4_4_ * auVar59._4_4_;
    auVar59._8_4_ = auVar72._8_4_ * auVar59._8_4_;
    auVar59._12_4_ = auVar72._12_4_ * auVar59._12_4_;
  }
  *(undefined1 (*) [16])((long)top_blob->data + uVar41 * 4) = auVar59;
LAB_00314c44:
  iVar36 = (int)uVar41 + (uVar40 >> 2 & 1) * 4;
  iVar35 = 0;
  if (iVar36 < (int)uVar40) {
    pfVar46 = (float *)(this->super_InnerProduct).activation_params.data;
    pvVar43 = (this->weight_data_tm).data;
    pvVar26 = top_blob->data;
    local_170 = uVar56 & 0xfffffff8;
    uVar41 = (ulong)iVar36;
    auVar217 = ZEXT3264(_DAT_005f0c40);
    auVar227 = ZEXT3264(_DAT_005f0c60);
    local_e8._8_8_ = 0x8000000000000000;
    local_e8._0_8_ = 0x8000000000000000;
    auVar235 = ZEXT1664(local_e8);
    auVar176 = vpcmpeqd_avx(auVar253,auVar253);
    auVar90 = ZEXT1664(auVar176);
    do {
      auVar176 = ZEXT816(0) << 0x40;
      if (pvVar24 != (void *)0x0) {
        auVar176 = ZEXT416(*(uint *)((long)pvVar24 + uVar41 * 4));
      }
      pfVar37 = (float *)((long)pvVar43 + uVar41 * lVar50 * 4);
      pfVar39 = pfVar49;
      if ((int)uVar56 < 8) {
        fVar257 = 0.0;
        fVar260 = 0.0;
        fVar261 = 0.0;
        fVar262 = 0.0;
        fVar263 = 0.0;
        fVar264 = 0.0;
        fVar265 = 0.0;
        fVar266 = 0.0;
        uVar40 = 0;
      }
      else {
        fVar257 = 0.0;
        fVar260 = 0.0;
        fVar261 = 0.0;
        fVar262 = 0.0;
        fVar263 = 0.0;
        fVar264 = 0.0;
        fVar265 = 0.0;
        fVar266 = 0.0;
        iVar35 = 7;
        do {
          fVar257 = *pfVar37 * *pfVar39 + fVar257;
          fVar260 = pfVar37[1] * pfVar39[1] + fVar260;
          fVar261 = pfVar37[2] * pfVar39[2] + fVar261;
          fVar262 = pfVar37[3] * pfVar39[3] + fVar262;
          fVar263 = pfVar37[4] * pfVar39[4] + fVar263;
          fVar264 = pfVar37[5] * pfVar39[5] + fVar264;
          fVar265 = pfVar37[6] * pfVar39[6] + fVar265;
          fVar266 = pfVar37[7] + fVar266;
          pfVar39 = pfVar39 + 8;
          pfVar37 = pfVar37 + 8;
          iVar35 = iVar35 + 8;
          uVar40 = local_170;
        } while (iVar35 < (int)uVar56);
      }
      fVar91 = 0.0;
      fVar132 = 0.0;
      fVar133 = 0.0;
      fVar134 = 0.0;
      uVar52 = uVar40 | 3;
      while ((int)uVar52 < (int)uVar56) {
        fVar91 = *pfVar37 * *pfVar39 + fVar91;
        fVar132 = pfVar37[1] * pfVar39[1] + fVar132;
        fVar133 = pfVar37[2] * pfVar39[2] + fVar133;
        fVar134 = pfVar37[3] * pfVar39[3] + fVar134;
        pfVar39 = pfVar39 + 4;
        pfVar37 = pfVar37 + 4;
        uVar52 = uVar40 + 7;
        uVar40 = uVar40 + 4;
      }
      auVar218 = auVar235._0_16_;
      if ((int)uVar40 < (int)uVar56) {
        uVar47 = CONCAT44(0,~uVar40 + uVar56);
        auVar176 = vblendps_avx(auVar176,_DAT_005ef030,0xe);
        auVar153._8_8_ = 0;
        auVar153._0_8_ = uVar47;
        auVar142 = vpshufd_avx(auVar153,0x44);
        auVar251 = vorps_avx(auVar218,auVar142);
        auVar180 = vorps_avx(auVar218,auVar142);
        uVar48 = 0;
        auVar241 = ZEXT1664(auVar176);
        do {
          auVar228 = auVar241;
          auVar209._8_8_ = 0;
          auVar209._0_8_ = uVar48;
          auVar176 = vpshufd_avx(auVar209,0x44);
          auVar226._16_16_ = auVar176;
          auVar226._0_16_ = auVar176;
          auVar81 = vorps_avx(auVar217._0_32_,auVar226);
          auVar233 = vorps_avx(auVar227._0_32_,auVar226);
          auVar176 = vorps_avx(auVar142,auVar218);
          uVar40 = auVar235._0_4_;
          auVar232._0_4_ = auVar233._16_4_ ^ uVar40;
          uVar52 = auVar235._4_4_;
          auVar232._4_4_ = auVar233._20_4_ ^ uVar52;
          uVar51 = auVar235._8_4_;
          auVar232._8_4_ = auVar233._24_4_ ^ uVar51;
          uVar28 = auVar235._12_4_;
          auVar232._12_4_ = auVar233._28_4_ ^ uVar28;
          auVar92 = vpcmpgtq_avx(auVar232,auVar176);
          auVar244._0_4_ = uVar40 ^ auVar233._0_4_;
          auVar244._4_4_ = uVar52 ^ auVar233._4_4_;
          auVar244._8_4_ = uVar51 ^ auVar233._8_4_;
          auVar244._12_4_ = uVar28 ^ auVar233._12_4_;
          auVar141 = vpcmpgtq_avx(auVar244,auVar251);
          auVar141 = vpackssdw_avx(auVar141,auVar92);
          auVar246._0_4_ = auVar81._16_4_ ^ uVar40;
          auVar246._4_4_ = auVar81._20_4_ ^ uVar52;
          auVar246._8_4_ = auVar81._24_4_ ^ uVar51;
          auVar246._12_4_ = auVar81._28_4_ ^ uVar28;
          auVar143 = vpcmpgtq_avx(auVar246,auVar176);
          auVar247._0_4_ = uVar40 ^ auVar81._0_4_;
          auVar247._4_4_ = uVar52 ^ auVar81._4_4_;
          auVar247._8_4_ = uVar51 ^ auVar81._8_4_;
          auVar247._12_4_ = uVar28 ^ auVar81._12_4_;
          auVar176 = vpcmpgtq_avx(auVar247,auVar180);
          auVar176 = vpackssdw_avx(auVar176,auVar143);
          auVar176 = vpackssdw_avx(auVar176 ^ auVar90._0_16_,auVar141 ^ auVar90._0_16_);
          auVar141 = vpmovsxwd_avx(auVar176);
          auVar176 = vpunpckhwd_avx(auVar176,auVar176);
          auVar249._16_16_ = auVar176;
          auVar249._0_16_ = auVar141;
          auVar238 = vmaskmovps_avx(auVar249,*(undefined1 (*) [32])(pfVar39 + uVar48));
          auVar113 = vmaskmovps_avx(auVar249,*(undefined1 (*) [32])(pfVar37 + uVar48));
          auVar176 = vpcmpeqd_avx(auVar238._0_16_,auVar238._0_16_);
          auVar90 = ZEXT1664(auVar176);
          auVar110._0_4_ = auVar228._0_4_ + auVar238._0_4_ * auVar113._0_4_;
          auVar110._4_4_ = auVar228._4_4_ + auVar238._4_4_ * auVar113._4_4_;
          auVar110._8_4_ = auVar228._8_4_ + auVar238._8_4_ * auVar113._8_4_;
          auVar110._12_4_ = auVar228._12_4_ + auVar238._12_4_ * auVar113._12_4_;
          auVar131._16_4_ = auVar228._16_4_ + auVar238._16_4_ * auVar113._16_4_;
          auVar131._0_16_ = auVar110;
          auVar131._20_4_ = auVar228._20_4_ + auVar238._20_4_ * auVar113._20_4_;
          auVar131._24_4_ = auVar228._24_4_ + auVar238._24_4_ * auVar113._24_4_;
          auVar131._28_4_ = auVar228._28_4_ + auVar113._28_4_;
          uVar48 = uVar48 + 8;
          auVar241 = ZEXT3264(auVar131);
        } while ((uVar47 + 8 & 0xfffffffffffffff8) != uVar48);
        auVar251 = vorps_avx(auVar218,auVar142);
        auVar214._0_4_ = uVar40 ^ auVar233._0_4_;
        auVar214._4_4_ = uVar52 ^ auVar233._4_4_;
        auVar214._8_4_ = uVar51 ^ auVar233._8_4_;
        auVar214._12_4_ = uVar28 ^ auVar233._12_4_;
        auVar251 = vpcmpgtq_avx(auVar214,auVar251);
        auVar251 = vpackssdw_avx(auVar251,auVar92);
        auVar218 = vorps_avx(auVar218,auVar142);
        auVar210._0_4_ = uVar40 ^ auVar81._0_4_;
        auVar210._4_4_ = uVar52 ^ auVar81._4_4_;
        auVar210._8_4_ = uVar51 ^ auVar81._8_4_;
        auVar210._12_4_ = uVar28 ^ auVar81._12_4_;
        auVar218 = vpcmpgtq_avx(auVar210,auVar218);
        auVar218 = vpackssdw_avx(auVar218,auVar143);
        auVar218 = vblendvps_avx(auVar228._0_16_,auVar110,auVar176 ^ auVar218);
        auVar176 = vblendvps_avx(auVar228._16_16_,auVar131._16_16_,auVar176 ^ auVar251);
        auVar176 = vhaddps_avx(auVar176,auVar218);
        auVar176 = vhaddps_avx(auVar176,auVar176);
        auVar176 = vhaddps_avx(auVar176,auVar176);
      }
      auVar62._0_4_ = fVar257 + fVar263 + fVar91;
      auVar62._4_4_ = fVar260 + fVar264 + fVar132;
      auVar62._8_4_ = fVar261 + fVar265 + fVar133;
      auVar62._12_4_ = fVar262 + fVar266 + fVar134;
      auVar218 = vhaddps_avx(auVar62,auVar62);
      auVar218 = vhaddps_avx(auVar218,auVar218);
      fVar257 = auVar218._0_4_ + auVar176._0_4_;
      auVar176 = ZEXT416((uint)fVar257);
      auVar218 = auVar90._0_16_;
      fVar260 = fVar257;
      switch(uVar38) {
      case 1:
        auVar176 = vmaxss_avx(auVar176,ZEXT416(0));
        fVar260 = auVar176._0_4_;
        break;
      case 2:
        auVar176 = vcmpss_avx(ZEXT816(0) << 0x20,auVar176,1);
        auVar112._8_4_ = 0x3f800000;
        auVar112._0_8_ = 0x3f8000003f800000;
        auVar112._12_4_ = 0x3f800000;
        auVar176 = vblendvps_avx(ZEXT416((uint)*pfVar46),auVar112,auVar176);
        fVar260 = auVar176._0_4_;
LAB_00314fbb:
        fVar260 = fVar260 * fVar257;
        break;
      case 3:
        auVar176 = vmaxss_avx(auVar176,ZEXT416((uint)*pfVar46));
        fVar260 = auVar176._0_4_;
        if (pfVar46[1] < auVar176._0_4_) {
          fVar260 = pfVar46[1];
        }
        break;
      case 4:
        auVar176 = vminss_avx(auVar176,ZEXT416(0x42b0c0a5));
        auVar79._0_8_ = auVar176._0_8_ ^ 0x8000000080000000;
        auVar79._8_4_ = auVar176._8_4_ ^ 0x80000000;
        auVar79._12_4_ = auVar176._12_4_ ^ 0x80000000;
        auVar176 = vcmpss_avx(auVar176,ZEXT416(0xc2b0c0a5),1);
        auVar111._8_4_ = 0x42b0c0a5;
        auVar111._0_8_ = 0x42b0c0a542b0c0a5;
        auVar111._12_4_ = 0x42b0c0a5;
        auVar176 = vblendvps_avx(auVar79,auVar111,auVar176);
        fVar257 = expf(auVar176._0_4_);
        auVar176 = vpcmpeqd_avx(auVar218,auVar218);
        auVar90 = ZEXT1664(auVar176);
        auVar235 = ZEXT1664(local_e8);
        auVar227 = ZEXT3264(_DAT_005f0c60);
        auVar217 = ZEXT3264(_DAT_005f0c40);
        fVar260 = 1.0 / (fVar257 + 1.0);
        break;
      case 5:
        fVar260 = expf(fVar257);
        fVar260 = logf(fVar260 + 1.0);
        fVar260 = tanhf(fVar260);
        auVar176 = vpcmpeqd_avx(auVar218,auVar218);
        auVar90 = ZEXT1664(auVar176);
        auVar235 = ZEXT1664(local_e8);
        auVar227 = ZEXT3264(_DAT_005f0c60);
        auVar217 = ZEXT3264(_DAT_005f0c40);
        fVar260 = fVar260 * fVar257;
        break;
      case 6:
        fVar261 = *pfVar46;
        fVar262 = -pfVar46[1] / fVar261;
        fVar260 = 0.0;
        if ((fVar262 <= fVar257) && (fVar260 = fVar257, fVar257 <= fVar262 + 1.0 / fVar261)) {
          fVar260 = fVar261 * fVar257 + pfVar46[1];
          goto LAB_00314fbb;
        }
      }
      *(float *)((long)pvVar26 + uVar41 * 4) = fVar260;
      uVar41 = uVar41 + 1;
    } while (uVar41 != local_d8);
LAB_00315027:
    iVar35 = 0;
  }
LAB_00315029:
  piVar23 = (int *)CONCAT44(uStack_12c,uStack_130);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_118 == (Allocator *)0x0) {
        if (local_138 != (float *)0x0) {
          free(local_138);
        }
      }
      else {
        (*local_118->_vptr_Allocator[3])();
      }
    }
  }
  return iVar35;
}

Assistant:

int InnerProduct_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}